

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu6502.h
# Opt level: O1

cpu_state cpu_execute(cpu_state state)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  byte bVar35;
  uint uVar36;
  byte bVar37;
  byte bVar38;
  uint uVar39;
  uint uVar40;
  cpu_state cVar41;
  uint uVar14;
  uint uVar15;
  uint uVar29;
  uint uVar30;
  
  uVar20 = state._8_8_;
  uVar10 = state._0_8_;
  if (state.rw_mode != '\x02' &&
      ((undefined1  [16])state & (undefined1  [16])0x100) == (undefined1  [16])0x0) {
    uVar21 = uVar20 | 0x200;
    goto LAB_00108bb4;
  }
  uVar33 = uVar10 >> 0x10;
  uVar31 = uVar10 >> 0x20;
  uVar12 = uVar10 >> 0x28;
  uVar26 = uVar10 >> 0x30;
  uVar36 = state._9_4_;
  bVar35 = state._9_1_ >> 4 & 1;
  uVar21 = (ulong)((uVar36 & 0xed |
                   (uint)((uVar12 & 4) == 0 & (byte)((uVar20 >> 8 & 0xffffffff) >> 2) & 0x3f) << 4)
                  << 8);
  uVar18 = uVar20 & 0xffffffffffff00ff;
  uVar16 = (uVar36 & 0xed) >> 5;
  bVar37 = (byte)uVar16 & 1;
  uVar34 = uVar21 | 0x2000;
  if ((uVar16 & 1) != 0) {
    uVar34 = uVar21;
  }
  if (((undefined1  [16])state & (undefined1  [16])0x800) == (undefined1  [16])0x0) {
    uVar34 = uVar21;
  }
  uVar19 = uVar18 | uVar34;
  uVar21 = uVar19;
  if (6 < (byte)state.cycle) goto switchD_00106223_caseD_2;
  bVar38 = state._9_1_ >> 1;
  uVar16 = state._0_4_;
  uVar22 = uVar16 + 1 & 0xffff;
  uVar40 = uVar22 >> 8;
  uVar25 = state._4_4_;
  uVar11 = uVar25 >> 8;
  uVar14 = (uint)uVar19;
  uVar3 = state.address;
  uVar24 = (uint)uVar3;
  uVar32 = state._2_4_;
  uVar23 = (uint)(uVar18 >> 0x20);
  uVar39 = (uint)uVar34;
  uVar28 = uVar25 >> 8;
  uVar29 = uVar25 >> 8;
  cVar8 = (char)(uVar18 >> 0x18);
  uVar15 = (uint)(uVar18 >> 0x10);
  bVar13 = (byte)(uVar18 >> 0x20);
  uVar30 = (uint)(uVar18 >> 0x18);
  uVar17 = state._12_4_;
  bVar5 = state.address._1_1_;
  uVar4 = state._8_4_;
  uVar7 = state._10_4_;
  uVar6 = state._11_4_;
  uVar2 = (ushort)(uVar18 >> 0x30);
  uVar18 = uVar33;
  switch(uVar10 & 0xff) {
  case 0:
    uVar22 = uVar36 & 0xff00 | uVar16 + 1 & 0xff;
    uVar21 = uVar20 & 0xffffffffffff0000 | uVar34;
    switch(uVar20 >> 0x10 & 0xff) {
    case 0:
      if (cVar8 == '\0') goto switchD_00106100_caseD_1;
    case 0x28:
    case 0x68:
      uVar21 = uVar21 | 1;
      uVar10 = (ulong)uVar22 | (ulong)(uVar32 << 0x10) | uVar10 & 0xffff00000000 | uVar33 << 0x30;
      goto LAB_00108bb4;
    default:
switchD_00106100_caseD_1:
      uVar21 = uVar21 | 1;
      uVar20 = uVar10 & 0xffff00000000 | uVar33 << 0x30;
      uVar10 = (ulong)(uVar16 + 0x10000 & 0xffff0000);
      goto LAB_00106125;
    case 2:
    case 0x12:
    case 0x22:
    case 0x32:
    case 0x42:
    case 0x52:
    case 0x62:
    case 0x72:
    case 0x92:
    case 0xb2:
    case 0xd2:
    case 0xf2:
      uVar20 = (ulong)uVar22;
      uVar10 = uVar10 & 0xffffffffffff0000;
      break;
    case 8:
      uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)((uVar11 & 0xef) << 0x10) + 0x100002;
      goto LAB_00108b5c;
    case 10:
      uVar12 = uVar19 * 2 & 0xfe00000000;
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | uVar12;
      uVar16 = ((uint)(uVar20 >> 0x1f) & 0x80) + (uint)(uVar12 == 0) * 2 |
               uVar23 >> 7 & 1 | uVar11 & 0x5c;
      goto LAB_00106697;
    case 0x18:
      uVar20 = 0xffffdeffffff0000;
      goto LAB_00108ba1;
    case 0x1a:
    case 0x3a:
    case 0x5a:
    case 0x7a:
    case 0xda:
    case 0xea:
    case 0xfa:
      uVar10 = uVar10 & 0xffffffffffff0000;
      goto LAB_00106128;
    case 0x2a:
      uVar16 = (uVar23 & 0xff) * 2;
      uVar36 = uVar16 & 0xff | uVar29 & 1;
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | (ulong)uVar36 << 0x20;
      uVar20 = (ulong)(((uVar23 & 0xff) >> 7 | uVar11 & 0x5c | uVar16 & 0x80) +
                       (uint)(uVar36 == 0) * 2 + 0x20);
LAB_0010674c:
      uVar10 = (ulong)uVar22 | uVar10 & 0xffff00ffffff0000 | uVar20 << 0x28;
      goto LAB_00108bb4;
    case 0x38:
      uVar20 = (ulong)uVar22 | uVar10 & 0xffffdeffffff0000;
      uVar10 = 0x210000000000;
      break;
    case 0x48:
      uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)(uVar15 & 0xff0000) + 2;
LAB_00108b5c:
      uVar10 = uVar10 & 0xff00ffff0000 | uVar10 + 0xff00000000 & 0xff00000000 |
               (uVar31 & 0xff) << 0x30 | (ulong)uVar22 | 0x100000000000000;
      goto LAB_00108bb4;
    case 0x4a:
      uVar12 = (uVar20 & 0xfe00000000) >> 1;
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | uVar12;
      uVar20 = (ulong)((uVar23 & 1 | uVar11 & 0x5c) + (uint)(uVar12 == 0) * 2);
      goto LAB_0010888e;
    case 0x58:
      uVar20 = 0xffffdbffffff0000;
      goto LAB_00108ba1;
    case 0x6a:
      uVar16 = uVar23 & 1 | uVar29 & 0x5c;
      uVar11 = (uVar11 & 1) << 7;
      uVar12 = (ulong)uVar11 + (ulong)(uVar23 >> 1 & 0x7f);
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | uVar12 << 0x20;
      goto LAB_001082de;
    case 0x78:
      uVar20 = (ulong)uVar22 | uVar10 & 0xffffdbffffff0000;
      uVar10 = 0x240000000000;
      break;
    case 0x88:
      uVar12 = uVar19 + 0xff000000000000 & 0xff000000000000;
      uVar21 = uVar20 & 0xff00ffffffff0000 | uVar34 | uVar12;
      uVar11 = uVar11 & 0x5d;
      uVar16 = ((ushort)(uVar19 + 0xff000000000000 >> 0x30) & 0x80) + (uint)(uVar12 == 0) * 2;
      goto LAB_001082ec;
    case 0x8a:
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | (uVar20 & 0xff0000000000) >> 8;
      uVar17 = uVar17 >> 8;
      goto LAB_00108a2e;
    case 0x98:
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | (uVar20 & 0xff000000000000) >> 0x10;
      uVar17 = (uint)state._14_2_;
      goto LAB_00108a2e;
    case 0x9a:
      uVar20 = (uVar20 & 0xff0000000000) >> 8;
      uVar34 = 0xffffff00ffff0000;
      goto LAB_00107b12;
    case 0xa8:
      uVar21 = uVar20 & 0xff00ffffffff0000 | uVar34 | (uVar20 & 0xff00000000) << 0x10;
LAB_00108a2e:
      uVar11 = uVar11 & 0x5d;
      uVar16 = (uVar17 & 0x80) + (uint)((char)uVar17 == '\0') * 2;
LAB_001082ec:
      uVar20 = (ulong)(uVar16 | uVar11) << 0x28;
LAB_001082ff:
      uVar20 = uVar10 & 0xffff00ffffff0000 | uVar20;
      goto LAB_00108ba4;
    case 0xaa:
      uVar21 = uVar20 & 0xffff00ffffff0000 | uVar34 | (uVar20 & 0xff00000000) << 8;
      uVar20 = (ulong)((uVar23 & 0x80) + (uint)(bVar13 == 0) * 2 | uVar11 & 0x5d) << 0x28;
      goto LAB_001082ff;
    case 0xb8:
      uVar20 = 0xffff9fffffff0000;
      goto LAB_00108ba1;
    case 0xba:
      uVar21 = uVar20 & 0xffff00ffffff0000 | uVar34 | (uVar31 & 0xff) << 0x28;
      uVar20 = (uVar31 & 0xff) << 0x20 |
               (ulong)((uVar25 & 0x80) + (uint)(state.S == '\0') * 2 | uVar11 & 0x5d) << 0x28 |
               uVar10 & 0xffff000000000000;
      uVar10 = (ulong)(uVar16 & 0xffff0000);
      goto LAB_00107214;
    case 200:
      uVar12 = uVar19 + 0x1000000000000 & 0xff000000000000;
      uVar21 = uVar20 & 0xff00ffffffff0000 | uVar34 | uVar12;
      uVar11 = uVar11 & 0x5d;
      uVar16 = ((ushort)(uVar19 + 0x1000000000000 >> 0x30) & 0x80) + (uint)(uVar12 == 0) * 2;
      goto LAB_001082ec;
    case 0xca:
      uVar12 = uVar19 + 0xff0000000000 & 0xff0000000000;
      uVar21 = uVar20 & 0xffff00ffffff0000 | uVar34 | uVar12;
      uVar16 = ((uint)(uVar19 + 0xff0000000000 >> 0x28) & 0x80) + (uint)(uVar12 == 0) * 2;
      goto LAB_00108c0a;
    case 0xd8:
      uVar20 = 0xffffd7ffffff0000;
LAB_00108ba1:
      uVar20 = uVar10 & uVar20;
LAB_00108ba4:
      uVar10 = uVar22 | uVar20 | 0x200000000000;
      goto LAB_00108bb4;
    case 0xe8:
      uVar12 = uVar19 + 0x10000000000 & 0xff0000000000;
      uVar21 = uVar20 & 0xffff00ffffff0000 | uVar34 | uVar12;
      uVar16 = ((uint)(uVar19 + 0x10000000000 >> 0x28) & 0x80) + (uint)(uVar12 == 0) * 2;
LAB_00108c0a:
      uVar20 = (ulong)(uVar16 | uVar11 & 0x5d) << 0x28;
      goto LAB_001082ff;
    case 0xf8:
      uVar20 = (ulong)uVar22 | uVar10 & 0xffffd7ffffff0000;
      uVar10 = 0x280000000000;
    }
LAB_0010612a:
    uVar10 = uVar10 | uVar20;
    goto LAB_00108bb4;
  case 1:
    uVar21 = uVar20 & 0xffffffffffff0000 | uVar34;
    switch(uVar40) {
    case 0:
      uVar16 = uVar16 >> 8;
LAB_001084b2:
      uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)(uVar16 & 0xff0000) + 2;
LAB_001084b9:
      uVar10 = uVar10 & 0xff00ffff0000 | uVar10 + 0xff00000000 & 0xff00000000 |
               (uVar31 & 0xff) << 0x30 | (ulong)uVar22 | 0x100000000000000;
      goto LAB_00108bb4;
    case 1:
    case 3:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x21:
    case 0x23:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x41:
    case 0x43:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x61:
    case 99:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x81:
    case 0x83:
    case 0xa1:
    case 0xa3:
    case 0xb4:
    case 0xb5:
    case 0xc1:
    case 0xc3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xe1:
    case 0xe3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
      uVar17 = uVar17 >> 8;
      goto LAB_001067dd;
    case 4:
    case 5:
    case 6:
    case 7:
    case 0x11:
    case 0x13:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x31:
    case 0x33:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x51:
    case 0x53:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x71:
    case 0x73:
    case 0x91:
    case 0x93:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xb1:
    case 0xb3:
    case 0xc4:
    case 0xc5:
    case 0xc6:
    case 199:
    case 0xd1:
    case 0xd3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xf1:
    case 0xf3:
      uVar21 = uVar21 | 1;
      uVar20 = (ulong)(uVar14 & 0xff0000) << 0x20;
      uVar10 = uVar10 & 0xffffffff0000;
      goto LAB_001067c0;
    case 8:
    case 0x48:
      goto switchD_00106167_caseD_3;
    case 9:
switchD_00106167_caseD_19:
      uVar23 = uVar7 & 0xffff | uVar23;
      goto LAB_00106c4e;
    case 0xb:
    case 0x2b:
      uVar23 = uVar7 & 0xffff & uVar23;
      uVar16 = uVar23 & 0xff;
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | (ulong)uVar16 << 0x20;
      uVar23 = uVar23 & 0x80;
      uVar36 = uVar23 >> 7 | uVar11 & 0x5c;
      goto LAB_001072a1;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x19:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x39:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x59:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x79:
    case 0x7b:
    case 0x7c:
    case 0x7d:
    case 0x7e:
    case 0x7f:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
    case 0x99:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xb9:
    case 0xbb:
    case 0xbc:
    case 0xbd:
    case 0xbe:
    case 0xbf:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd9:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
    case 0xf9:
    case 0xfb:
    case 0xfc:
    case 0xfd:
    case 0xfe:
    case 0xff:
      uVar34 = (ulong)((uVar14 & 0xff0000) << 8) + (uVar20 & 0xffffffff00ff0000 | uVar34) + 1;
      uVar12 = uVar10 & 0xffff00000000 | uVar33 << 0x30;
      uVar10 = (ulong)(uVar16 + 0x10000 & 0xffff0000);
      goto LAB_001062bb;
    case 0x10:
      if ((char)state.P < '\0') break;
      goto LAB_0010867e;
    case 0x20:
      uVar21 = uVar20 & 0xffffffff00ff0000 | uVar34 | (ulong)((uVar14 & 0xff0000) << 8);
      uVar10 = uVar10 & 0xffffffffffff0000;
      goto LAB_0010653f;
    case 0x28:
    case 0x40:
    case 0x60:
    case 0x68:
      uVar21 = uVar21 | 1;
      uVar20 = (ulong)(uVar25 + 1 & 0xff);
      uVar10 = (ulong)uVar22 |
               (ulong)(uVar16 & 0xffff0000) |
               uVar20 << 0x20 | uVar10 & 0xff0000000000 | uVar20 << 0x30 | 0x100000000000000;
      goto LAB_00108bb4;
    case 0x29:
switchD_00106167_caseD_39:
      uVar23 = uVar7 & 0xffff & uVar23;
      goto LAB_00106c4e;
    case 0x30:
      if ((char)state.P < '\0') goto LAB_0010867e;
      break;
    case 0x49:
switchD_00106167_caseD_59:
      uVar23 = uVar7 & 0xffff ^ uVar23;
LAB_00106c4e:
      uVar10 = 0xffffff00ffffff00;
LAB_001070a0:
      uVar12 = (ulong)((uVar23 & 0x80 | uVar11 & 0x5d) + (uint)((uVar23 & 0xff) == 0) * 2 + 0x20);
      uVar21 = uVar10 & uVar19 | (ulong)(uVar23 & 0xff) << 0x20;
      break;
    case 0x4b:
      uVar23 = uVar7 & 0xffff & uVar23;
      uVar16 = uVar23 >> 1 & 0x7f;
      uVar12 = (ulong)((uVar23 & 1 | uVar11 & 0x5c) + (uint)(uVar16 == 0) * 2 + 0x20);
      uVar21 = (ulong)uVar16 << 0x20 | uVar20 & 0xffffff00ffff0000 | uVar34;
      break;
    case 0x50:
      if ((uVar12 & 0x40) == 0) goto LAB_0010867e;
      break;
    case 0x69:
switchD_00106167_caseD_79:
      uVar25 = (uVar28 & 1) + (uVar7 & 0xff) + (uVar23 & 0xff);
      uVar23 = ((uVar23 ^ uVar25) & (uVar7 & 0xffff ^ uVar25)) >> 1 & 0x40;
      uVar36 = uVar25 >> 8 & 1;
      uVar16 = uVar25 & 0xff;
      uVar21 = (ulong)uVar16 << 0x20;
      uVar10 = 0xffffff00ffffff00;
LAB_00107289:
      uVar21 = uVar10 & uVar19 | uVar21;
      uVar36 = uVar25 & 0x80 | uVar11 & 0x1c | uVar36;
LAB_001072a1:
      uVar12 = (ulong)(uVar36 + (uint)(uVar16 == 0) * 2 + uVar23 + 0x20);
      break;
    case 0x6b:
      uVar23 = uVar7 & 0xffff & uVar23;
      uVar16 = uVar11 * 0x80 & 0xff | uVar23 >> 1 & 0x7f;
      uVar12 = (ulong)(uVar11 * 0x80 +
                       (uVar23 >> 7 & 1 | uVar29 & 0x1c | (uVar23 >> 1 ^ uVar23) & 0x40) +
                       (uint)(uVar16 == 0) * 2 + 0x20);
      uVar21 = (ulong)uVar16 << 0x20 | uVar20 & 0xffffff00ffff0000 | uVar34;
      break;
    case 0x70:
      if ((uVar12 & 0x40) != 0) goto LAB_0010867e;
      break;
    case 0x84:
      goto LAB_001085c9;
    case 0x85:
      uVar23 = uVar15;
      goto LAB_001085c9;
    case 0x86:
      uVar23 = uVar30;
LAB_001085c9:
      uVar23 = uVar23 & 0xff0000;
LAB_001085cf:
      uVar21 = (ulong)uVar23 + (uVar20 & 0xffffffffff000000 | uVar34) + 2;
      uVar10 = (ulong)uVar22 | uVar10 & 0xffffffff0000 | (ulong)(uVar14 & 0xff0000) << 0x20;
      goto LAB_00108bb4;
    case 0x87:
      uVar23 = (uVar23 >> 8 & uVar23 & 0xff) << 0x10;
      goto LAB_001085cf;
    case 0x8b:
      uVar23 = uVar7 & 0xffff & uVar23 >> 8 & uVar23;
      uVar16 = uVar23 & 0xff;
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | (ulong)(byte)uVar23 << 0x20;
LAB_0010846f:
      uVar36 = uVar23 & 0x80 | uVar11 & 0x5d;
      goto LAB_0010847d;
    case 0x90:
      uVar34 = uVar12 & 1;
      goto joined_r0x00108430;
    case 0x94:
      uVar12 = (ulong)((uVar23 >> 8) + (uVar7 & 0xffff) & 0xff);
      goto LAB_00108584;
    case 0x95:
      uVar12 = (ulong)((uVar23 >> 8) + (uVar7 & 0xffff) & 0xff);
      uVar23 = uVar15;
      goto LAB_00108584;
    case 0x96:
      uVar12 = (ulong)((uint)uVar2 + (uVar7 & 0xffff) & 0xff);
      uVar23 = uVar30;
LAB_00108584:
      uVar34 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)(uVar23 & 0xff0000) + 2;
LAB_001086ac:
      uVar12 = uVar12 << 0x30;
      uVar10 = uVar10 & 0xffffffff0000;
LAB_001062bb:
      uVar10 = uVar10 | uVar12;
LAB_001069d9:
      uVar10 = uVar10 | uVar22;
      uVar21 = uVar34;
      goto LAB_00108bb4;
    case 0x97:
      uVar12 = (ulong)((uint)uVar2 + (uVar7 & 0xffff) & 0xff);
      uVar34 = (uVar20 & 0xffffffffff000000 | uVar34) +
               (ulong)((uVar23 >> 8 & uVar23 & 0xff) << 0x10) + 2;
      goto LAB_001086ac;
    case 0xa0:
switchD_0010646c_caseD_bc:
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar21 = uVar10 << 0x20;
      uVar20 = 0xff00ffffffffff00;
      goto LAB_001076ca;
    case 0xa2:
switchD_0010646c_caseD_be:
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar21 = uVar10 << 0x18;
      uVar20 = 0xffff00ffffffff00;
      goto LAB_001076ca;
    case 0xa9:
switchD_0010646c_caseD_b9:
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar21 = uVar10 << 0x10;
      uVar20 = 0xffffff00ffffff00;
LAB_001076ca:
      uVar21 = uVar20 & uVar19 | uVar21;
LAB_00108c4a:
      lVar27 = (ulong)(uVar11 & 0x5d) + (ulong)(uVar10 == 0) * 2;
LAB_00108c63:
      uVar12 = (ulong)(uVar14 >> 0x10 & 0x80) + lVar27 + 0x20;
      break;
    case 0xab:
switchD_0010646c_caseD_bf:
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar20 = uVar10 << 0x10;
      uVar21 = 0xffff0000ffffff00;
LAB_00108c3a:
      uVar21 = uVar10 << 0x18 | uVar21 & uVar19 | uVar20;
      goto LAB_00108c4a;
    case 0xb0:
      uVar34 = uVar12 & 1;
      goto joined_r0x0010851f;
    case 0xb6:
    case 0xb7:
      uVar17 = (uint)uVar2;
LAB_001067dd:
      uVar21 = uVar21 | 1;
      uVar10 = uVar10 & 0xffffffff0000 | (ulong)(uVar17 + (uVar7 & 0xffff) & 0xff) << 0x30;
LAB_00106f20:
      uVar20 = (ulong)uVar22;
LAB_00106f22:
      uVar10 = uVar10 | uVar20;
      goto LAB_00108bb4;
    case 0xc0:
      uVar23 = (uint)uVar2;
      goto LAB_00106b5d;
    case 0xc9:
switchD_0010646c_caseD_d9:
      goto LAB_00106b5d;
    case 0xcb:
      uVar23 = uVar23 >> 8 & uVar23;
      uVar36 = uVar23 - (uVar7 & 0xffff);
      uVar16 = uVar36 & 0xff;
      uVar21 = uVar20 & 0xffff00ffffff0000 | uVar34 | (ulong)uVar16 << 0x28;
      uVar36 = uVar36 & 0x80 | uVar11 & 0x5c | (uint)((uVar7 & 0xff) <= (uVar23 & 0xff));
LAB_0010847d:
      uVar12 = (ulong)(uVar36 + (uint)(uVar16 == 0) * 2 + 0x20);
      break;
    case 0xd0:
      uVar34 = uVar12 & 2;
joined_r0x00108430:
      if (uVar34 != 0) break;
LAB_0010867e:
      uVar12 = (ulong)((int)(char)state.data + uVar32);
      uVar34 = uVar20 & 0xffffffffffff0000 | (ulong)(uVar39 & 0xed00);
      if ((uVar39 >> 0xc & 1) == 0) {
        uVar34 = uVar21;
      }
      if (bVar35 != 0) {
        uVar34 = uVar21;
      }
      goto LAB_001086ac;
    case 0xe0:
      uVar23 = uVar23 >> 8;
LAB_00106b5d:
      uVar16 = (uVar23 & 0xff) - (uVar14 >> 0x10 & 0xff);
      cVar8 = (char)uVar16;
      uVar36 = uVar16 & 0x80 | uVar11 & 0x5c | uVar16 >> 8 & 1;
LAB_00106b88:
      uVar21 = uVar20 & 0xffffffffffff0000 | uVar34;
      uVar36 = uVar36 + (uint)(cVar8 == '\0') * 2;
LAB_0010705e:
      uVar12 = (ulong)(uVar36 ^ 0x21);
      break;
    case 0xe9:
    case 0xeb:
switchD_0010646c_caseD_f9:
      uVar16 = ~(uVar4 & 0xffff00ff) >> 0x10;
      uVar36 = (uVar28 & 1) + (uVar23 & 0xff) + (uVar16 | 0xffffff00);
      uVar16 = (uVar23 ^ uVar36) & (uVar16 ^ uVar36);
      uVar10 = 0xffffff00ffffff00;
LAB_0010703e:
      uVar21 = uVar10 & uVar19 | (ulong)(uVar36 & 0xff) << 0x20;
      uVar36 = (uVar36 & 0x80 | uVar11 & 0x1c | uVar36 >> 8 & 1) + (uint)((uVar36 & 0xff) == 0) * 2;
LAB_0010705c:
      uVar36 = uVar36 | uVar16 >> 1 & 0x40;
      goto LAB_0010705e;
    case 0xf0:
      uVar34 = uVar12 & 2;
joined_r0x0010851f:
      if (uVar34 == 0) break;
      goto LAB_0010867e;
    }
switchD_00106307_caseD_5c:
    iVar9 = (int)uVar18;
    if (bVar37 == 0 && bVar35 == 0) {
      uVar21 = (uVar21 & 0xffffffff00ffff00) + 1;
      iVar9 = iVar9 + 1;
      uVar26 = uVar18 & 0xffffffff;
    }
    else {
      uVar21 = uVar21 & 0xffffffff0000ff00 | 0xfe000000;
    }
    uVar10 = (ulong)(uint)(iVar9 << 0x10) |
             (uVar31 & 0xff) << 0x20 | (uVar12 & 0xff) << 0x28 | uVar26 << 0x30;
    goto LAB_00108bb4;
  case 2:
    switch(uVar40) {
    case 0:
      uVar21 = uVar20 & 0xffffffffff0000ff | uVar34 | (ulong)(uVar16 & 0xff0000);
      goto LAB_001084b9;
    case 1:
    case 3:
    case 0x11:
    case 0x13:
    case 0x21:
    case 0x23:
    case 0x31:
    case 0x33:
    case 0x41:
    case 0x43:
    case 0x51:
    case 0x53:
    case 0x61:
    case 99:
    case 0x71:
    case 0x73:
    case 0x81:
    case 0x83:
    case 0x91:
    case 0x93:
    case 0xa1:
    case 0xa3:
    case 0xb1:
    case 0xb3:
    case 0xc1:
    case 0xc3:
    case 0xd1:
    case 0xd3:
    case 0xe1:
    case 0xe3:
    case 0xf1:
    case 0xf3:
      uVar34 = (ulong)((uVar14 & 0xff0000) << 8) + (uVar20 & 0xffffffff00ff0000 | uVar34) + 1;
      uVar21 = uVar10 + 0x1000000000000 & 0xff000000000000;
      goto LAB_001061fa;
    case 5:
switchD_00106223_caseD_d:
      uVar23 = uVar7 & 0xffff | uVar23;
      goto LAB_00107084;
    case 6:
    case 7:
    case 0x16:
    case 0x17:
    case 0x26:
    case 0x27:
    case 0x36:
    case 0x37:
    case 0x46:
    case 0x47:
    case 0x56:
    case 0x57:
    case 0x66:
    case 0x67:
    case 0x76:
    case 0x77:
    case 0x97:
    case 0xc6:
    case 199:
    case 0xd6:
    case 0xd7:
    case 0xe6:
    case 0xe7:
    case 0xf6:
    case 0xf7:
switchD_00106223_caseD_e:
      uVar34 = uVar20 & 0xffffffffffff0000 | uVar34 | 2;
      goto LAB_001069d3;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
switchD_00106223_caseD_1:
      uVar21 = (uVar20 & 0xffffffffffff0000 | uVar34) + 1;
      uVar10 = uVar10 & 0xffffffff0000 | (ulong)(uVar14 >> 0x18 | uVar36 & 0xff00) << 0x30;
      goto LAB_0010653f;
    case 0x10:
    case 0x30:
    case 0x50:
    case 0x70:
    case 0x90:
    case 0xb0:
    case 0xd0:
    case 0xf0:
      if (((uVar33 ^ uVar26) & 0xff00) != 0) {
        uVar10 = (ulong)uVar22 | (ulong)uVar3 << 0x10 | uVar10 & 0xffffffff00000000;
      }
      uVar18 = uVar26;
      if (((uVar33 ^ uVar26) & 0xff00) != 0) goto LAB_00108bb4;
      goto switchD_00106307_caseD_5c;
    case 0x14:
    case 0x15:
    case 0x34:
    case 0x35:
    case 0x54:
    case 0x55:
    case 0x60:
    case 0x74:
    case 0x75:
    case 0x94:
    case 0x95:
    case 0x96:
    case 0xd4:
    case 0xd5:
    case 0xf4:
    case 0xf5:
      uVar34 = uVar20 & 0xffffffffffff0000 | uVar34;
LAB_001069d3:
      uVar10 = uVar10 & 0xffffffffffff0000;
      goto LAB_001069d9;
    case 0x19:
    case 0x1b:
    case 0x39:
    case 0x3b:
    case 0x59:
    case 0x5b:
    case 0x79:
    case 0x7b:
    case 0x99:
    case 0x9b:
    case 0x9e:
    case 0x9f:
    case 0xb9:
    case 0xbb:
    case 0xbe:
    case 0xbf:
    case 0xd9:
    case 0xdb:
    case 0xf9:
    case 0xfb:
switchD_00106223_caseD_11:
      uVar17 = (uint)state._14_2_;
      goto LAB_0010681e;
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x7c:
    case 0x7d:
    case 0x7e:
    case 0x7f:
    case 0x9c:
    case 0x9d:
    case 0xbc:
    case 0xbd:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
    case 0xfc:
    case 0xfd:
    case 0xfe:
    case 0xff:
      uVar17 = uVar17 >> 8;
LAB_0010681e:
      uVar34 = (ulong)(((uVar17 & 0xff) + (uVar30 & 0xff) & 0x100) << 0x10) +
               (uVar20 & 0xffffffff00ff0000 | uVar34) + 1;
      uVar10 = uVar10 & 0xffffffff0000 | (ulong)(uVar30 + uVar17 & 0xff | uVar36 & 0xff00) << 0x30;
      goto LAB_001069d9;
    case 0x20:
      uVar21 = (ulong)(uVar16 >> 8);
LAB_001080ca:
      uVar16 = (uint)uVar21;
      goto LAB_001084b2;
    case 0x24:
switchD_00106223_caseD_2c:
      uVar12 = (ulong)(((uint)((uVar20 & 0xffff00ff) >> 0x10) & 0xc0 | uVar11 & 0x1d) +
                       (uint)(((byte)((uVar20 & 0xffff00ff) >> 0x10) & bVar13) == 0) * 2 + 0x20);
      break;
    case 0x25:
switchD_00106223_caseD_2d:
      uVar23 = uVar7 & 0xffff & uVar23;
      goto LAB_00107084;
    case 0x28:
      uVar21 = uVar20 & 0xffffffffffff0000 | uVar34;
      uVar10 = (ulong)uVar22 | uVar10 & 0xffff00ffffff0000 | (ulong)(uVar14 & 0xcf0000) << 0x18 |
               0x200000000000;
      goto LAB_00108bb4;
    case 0x40:
      uVar21 = (uVar20 & 0xffffffffffff0000 | uVar34) + 1;
      uVar10 = (ulong)(uVar25 + 1 & 0xff);
      uVar20 = (ulong)uVar22 |
               (ulong)(uVar16 & 0xffff0000) |
               uVar10 << 0x20 | (ulong)(uVar14 & 0xcf0000) << 0x18 | uVar10 << 0x30;
      uVar10 = 0x100200000000000;
      goto LAB_00106541;
    case 0x45:
switchD_00106223_caseD_4d:
      uVar23 = uVar7 & 0xffff ^ uVar23;
LAB_00107084:
      uVar10 = 0xffffff00ffffffff;
      goto LAB_001070a0;
    case 0x4c:
      uVar33 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      break;
    case 0x65:
switchD_00106223_caseD_6d:
      uVar25 = (uVar28 & 1) + (uVar7 & 0xff) + (uVar23 & 0xff);
      uVar36 = (uVar23 ^ uVar25) & (uVar7 & 0xffff ^ uVar25);
      uVar10 = 0xffffff00ffffff00;
LAB_00107282:
      uVar16 = uVar25 & 0xff;
      uVar23 = uVar36 >> 1 & 0x40;
      uVar36 = uVar25 >> 8 & 1;
      uVar21 = (ulong)uVar16 << 0x20;
      goto LAB_00107289;
    case 0x68:
switchD_001061ba_caseD_68:
      uVar12 = (ulong)(uVar4 & 0xff0000);
      uVar20 = uVar12 << 0x10;
      uVar21 = 0xffffff00ffffff00;
      goto LAB_001082cc;
    case 0x8c:
      uVar21 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      goto LAB_0010811c;
    case 0x8d:
switchD_00106223_caseD_81:
      uVar21 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      uVar17 = uVar15;
      goto LAB_0010811c;
    case 0x8e:
      uVar21 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      uVar17 = uVar30;
LAB_0010811c:
      uVar17 = uVar17 & 0xff0000;
LAB_00108122:
      uVar34 = (ulong)uVar17 + (uVar20 & 0xffffffffff000000 | uVar34) + 2;
      uVar21 = uVar21 << 0x30;
LAB_001061fa:
      uVar10 = uVar10 & 0xffffffff0000 | uVar21;
      goto LAB_001069d9;
    case 0x8f:
switchD_00106223_caseD_83:
      uVar21 = (ulong)(uVar6 & 0xff | uVar36 & 0xff00);
      uVar17 = (uVar23 >> 8 & uVar23 & 0xff) << 0x10;
      goto LAB_00108122;
    case 0xa4:
switchD_00106223_caseD_ac:
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar21 = uVar10 << 0x20;
      uVar20 = 0xff00ffffffffff00;
      goto LAB_001076ca;
    case 0xa5:
switchD_00106223_caseD_ad:
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar21 = uVar10 << 0x10;
      uVar20 = 0xffffff00ffffff00;
      goto LAB_001076ca;
    case 0xa6:
switchD_00106223_caseD_ae:
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar21 = uVar10 << 0x18;
      uVar20 = 0xffff00ffffffffff;
      goto LAB_001076ca;
    case 0xa7:
switchD_00106223_caseD_af:
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar20 = uVar10 << 0x10;
      uVar21 = 0xffff0000ffffffff;
      goto LAB_00108c3a;
    case 0xb4:
      uVar12 = (ulong)(uVar4 & 0xff0000);
      uVar20 = uVar12 << 0x20;
      uVar21 = 0xff00ffffffffff00;
      goto LAB_001082c5;
    case 0xb5:
      uVar12 = (ulong)(uVar4 & 0xff0000);
      uVar20 = uVar12 << 0x10;
      uVar21 = 0xffffff00ffffff00;
LAB_001082c5:
      uVar21 = uVar21 | 0xff;
LAB_001082cc:
      uVar21 = uVar21 & uVar19;
LAB_001082cf:
      uVar21 = uVar21 | uVar20;
LAB_001082d2:
      uVar11 = uVar11 & 0x5d;
      uVar16 = (uint)(uVar19 >> 0x10) & 0x80;
LAB_001082de:
      uVar16 = uVar16 + (uint)(uVar12 == 0) * 2;
      goto LAB_001082ec;
    case 0xb6:
      uVar21 = uVar20 & 0xffff00ffffff00ff | uVar34 | (ulong)(uVar4 & 0xff0000) << 0x18;
      uVar16 = (uVar14 >> 0x10 & 0x80) + (uint)((ulong)(uVar4 & 0xff0000) == 0) * 2;
      goto LAB_00108c0a;
    case 0xb7:
      uVar20 = 0xffff0000ffffffff;
LAB_00108268:
      uVar12 = (ulong)(uVar4 & 0xff0000);
      uVar20 = uVar20 & uVar19 | uVar12 << 0x10;
      uVar21 = uVar12 << 0x18;
      goto LAB_001082cf;
    case 0xc4:
switchD_00106223_caseD_cc:
      uVar23 = (uint)uVar2;
      goto LAB_001075eb;
    case 0xc5:
switchD_00106223_caseD_cd:
      goto LAB_001075eb;
    case 0xe4:
switchD_00106223_caseD_ec:
      uVar23 = uVar23 >> 8;
LAB_001075eb:
      uVar16 = (uVar23 & 0xff) - (uVar7 & 0xff);
      cVar8 = (char)uVar16;
      uVar16 = uVar16 & 0x80 | uVar11 & 0x5c | uVar16 >> 8 & 1;
LAB_00107617:
      uVar12 = (ulong)(uVar16 + (uint)(cVar8 == '\0') * 2 ^ 0x21);
      break;
    case 0xe5:
switchD_00106223_caseD_ed:
      uVar16 = ~(uVar4 & 0xffff00ff) >> 0x10;
      uVar36 = (uVar28 & 1) + (uVar23 & 0xff) + (uVar16 | 0xffffff00);
      uVar16 = (uVar23 ^ uVar36) & (uVar16 ^ uVar36);
      uVar10 = 0xffffff00ffffffff;
      goto LAB_0010703e;
    }
switchD_00106223_caseD_2:
    uVar18 = uVar33;
    goto switchD_00106307_caseD_5c;
  case 4:
    uVar21 = uVar20 & 0xffffffffffff0000 | uVar34;
    if (0xa0 < uVar40) {
      switch(uVar40) {
      case 0xb1:
        if (cVar8 == '\0') {
          uVar10 = (ulong)(uVar4 & 0xff0000);
          uVar21 = uVar10 << 0x10;
          uVar20 = 0xffffff0000ffff00;
          goto LAB_001076ca;
        }
        goto LAB_00107c36;
      case 0xb2:
      case 0xb4:
      case 0xb5:
      case 0xb6:
      case 0xb7:
      case 0xb8:
      case 0xba:
      case 0xc0:
      case 0xc2:
      case 0xc4:
      case 0xc5:
      case 0xc6:
      case 199:
      case 200:
      case 0xc9:
      case 0xca:
      case 0xcb:
      case 0xcc:
      case 0xcd:
      case 0xd0:
      case 0xd2:
      case 0xd4:
      case 0xd5:
      case 0xd8:
      case 0xda:
      case 0xdc:
      case 0xe0:
      case 0xe2:
      case 0xe4:
      case 0xe5:
      case 0xe6:
      case 0xe7:
      case 0xe8:
      case 0xe9:
      case 0xea:
      case 0xeb:
      case 0xec:
      case 0xed:
      case 0xf0:
      case 0xf2:
      case 0xf4:
      case 0xf5:
      case 0xf8:
      case 0xfa:
      case 0xfc:
        break;
      case 0xb3:
        if (cVar8 != '\0') {
          uVar21 = uVar21 | 1;
          uVar10 = (ulong)uVar22 + (uVar10 & 0xffffffff0000) + (uVar10 & 0xffff000000000000) +
                   0x100000000000000;
          goto LAB_00108bb4;
        }
        uVar10 = (ulong)(uVar4 & 0xff0000);
        uVar20 = uVar10 << 0x10;
        uVar21 = 0xffff000000ffff00;
        goto LAB_00108c3a;
      case 0xb9:
      case 0xbd:
        goto switchD_0010646c_caseD_b9;
      case 0xbb:
        uVar25 = uVar25 & uVar7 & 0xffff;
        uVar31 = (ulong)uVar25;
        uVar10 = uVar31 & 0xff;
        uVar12 = (ulong)((uVar25 & 0x80 | uVar11 & 0x5d) + (uint)((int)uVar10 == 0) * 2 + 0x20);
        uVar21 = uVar10 << 0x28 | uVar20 & 0xffff0000ffff0000 | uVar34 | uVar10 << 0x20;
        break;
      case 0xbc:
        goto switchD_0010646c_caseD_bc;
      case 0xbe:
        goto switchD_0010646c_caseD_be;
      case 0xbf:
        goto switchD_0010646c_caseD_bf;
      case 0xc1:
        uVar16 = (uVar23 & 0xff) - (uVar14 >> 0x10 & 0xff);
        uVar10 = (ulong)uVar22 | uVar10 & 0xffff00ffffff0000 |
                 (ulong)((uVar16 & 0x80 | uVar11 & 0x5c | uVar16 >> 8 & 1) +
                         (uint)((char)uVar16 == '\0') * 2 ^ 0x21) << 0x28;
        goto LAB_00108bb4;
      case 0xc3:
      case 0xd6:
      case 0xd7:
      case 0xe3:
      case 0xf6:
      case 0xf7:
        goto switchD_00106167_caseD_3;
      case 0xce:
switchD_001066ec_caseD_de:
        uVar21 = uVar19 + 0xff0000 & 0xff0000;
        lVar27 = (uVar20 & 0xffffffffff000000 | uVar34) + uVar21;
        uVar16 = ((uint)(uVar19 + 0xff0000 >> 0x10) & 0x80) + (uint)(uVar21 == 0) * 2;
        goto LAB_00106d7d;
      case 0xcf:
switchD_001066ec_caseD_db:
        lVar27 = (uVar19 + 0xff0000 & 0xff0000) + (uVar20 & 0xffffffffff000000 | uVar34);
        uVar16 = (uVar23 & 0xff) - ((uint)(uVar19 + 0xff0000 >> 0x10) & 0xff);
        goto LAB_00106723;
      case 0xd1:
        if (cVar8 != '\0') goto LAB_00107c36;
        uVar16 = (uVar17 & 0xff) - (uVar14 >> 0x10);
        cVar8 = (char)uVar16;
        uVar36 = uVar16 & 0x80 | uVar11 & 0x5c | uVar16 >> 8 & 1;
        goto LAB_00106b88;
      case 0xd3:
      case 0xf3:
        goto switchD_00106167_caseD_13;
      case 0xd9:
      case 0xdd:
        goto switchD_0010646c_caseD_d9;
      case 0xdb:
      case 0xde:
      case 0xdf:
      case 0xfb:
      case 0xfe:
      case 0xff:
        goto switchD_00106307_caseD_63;
      case 0xe1:
        uVar16 = ~(uVar4 & 0xffff00ff) >> 0x10;
        uVar36 = (uVar29 & 1) + (uVar23 & 0xff) + (uVar16 | 0xffffff00);
        uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | (ulong)(uVar36 & 0xff) << 0x20;
        uVar16 = (uVar36 & 0x80 | uVar11 & 0x1c | uVar36 >> 8 & 1) +
                 (uint)((uVar36 & 0xff) == 0) * 2 |
                 ((uVar23 ^ uVar36) & (uVar16 ^ uVar36)) >> 1 & 0x40;
        goto LAB_00106749;
      case 0xee:
switchD_0010646c_caseD_ee:
        uVar21 = (ulong)(uVar14 + 0x10000 & 0xff0000);
        lVar27 = (uVar20 & 0xffffffffff000000 | uVar34) + uVar21;
        uVar16 = (uVar14 + 0x10000 >> 0x10 & 0x80) + (uint)(uVar21 == 0) * 2;
LAB_00106d7d:
        uVar21 = lVar27 + 2;
        uVar16 = uVar16 | uVar11 & 0x5d;
LAB_00107203:
        uVar20 = (ulong)uVar16 << 0x28;
        uVar10 = uVar10 & 0xffff00ffffff0000;
LAB_00107214:
        uVar10 = uVar10 | uVar20;
        goto LAB_00107217;
      case 0xef:
        goto switchD_0010646c_caseD_ef;
      case 0xf1:
        if (cVar8 == '\0') {
          uVar36 = (uVar29 & 1) + ~(uVar7 & 0xffff) + (uVar23 & 0xff);
          uVar16 = (uVar23 ^ uVar36) & (~(uVar7 & 0xffff) ^ uVar36);
          uVar10 = 0xffffff0000ffff00;
          goto LAB_00107845;
        }
        goto LAB_00107c36;
      case 0xf9:
      case 0xfd:
        goto switchD_0010646c_caseD_f9;
      default:
        if (uVar40 == 0xa1) goto switchD_001061ba_caseD_68;
        if (uVar40 == 0xa3) {
          uVar20 = 0xffff0000ffffff00;
          goto LAB_00108268;
        }
      }
      goto switchD_00106307_caseD_5c;
    }
    switch(uVar40) {
    case 0:
      uVar21 = uVar21 | 1;
      uVar20 = (ulong)uVar22 | uVar10 & 0xdbffffff0000 | (ulong)(uVar14 & 0xff000000) << 0x18;
      uVar10 = 0xff00240000000000;
      goto LAB_00106f22;
    case 1:
      uVar23 = uVar7 & 0xffff | uVar23;
      goto LAB_00107ad9;
    default:
      goto switchD_00106307_caseD_5c;
    case 3:
    case 0x16:
    case 0x17:
    case 0x23:
    case 0x36:
    case 0x37:
    case 0x43:
    case 0x56:
    case 0x57:
    case 99:
    case 0x76:
    case 0x77:
    case 0x81:
    case 0x83:
switchD_00106167_caseD_3:
      uVar10 = uVar10 & 0xffffffffffff0000;
      goto LAB_00106f20;
    case 0xe:
switchD_001064bd_caseD_1e:
      uVar16 = uVar14 * 2 & 0xfe0000;
      lVar27 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)uVar16;
      uVar10 = (ulong)uVar22 |
               uVar10 & 0xffff00ffffff0000 |
               (ulong)((uVar14 >> 0xf & 0x80) + (uint)(uVar16 == 0) * 2 |
                      (uint)((uVar20 & 0xffff00ff) >> 0x17) & 1 | uVar11 & 0x5c) << 0x28 |
               0x200000000000;
      goto LAB_00106e8c;
    case 0xf:
      goto switchD_001064bd_caseD_1b;
    case 0x11:
      if (cVar8 == '\0') {
        uVar10 = uVar19 << 0x10 | uVar19;
LAB_00107b34:
        uVar20 = 0xffffff0000ffff00;
        goto LAB_00107b4b;
      }
      break;
    case 0x13:
    case 0x33:
    case 0x53:
    case 0x73:
switchD_00106167_caseD_13:
      uVar21 = uVar21 | 1;
      uVar10 = uVar10 & 0xffffffff0000 | (ulong)(uVar24 + (uVar14 >> 0x10 & 0xff00)) << 0x30;
      goto LAB_00106f20;
    case 0x19:
    case 0x1d:
      goto switchD_00106167_caseD_19;
    case 0x1b:
    case 0x1e:
    case 0x1f:
    case 0x3b:
    case 0x3e:
    case 0x3f:
    case 0x5b:
    case 0x5e:
    case 0x5f:
    case 0x7b:
    case 0x7e:
    case 0x7f:
      goto switchD_00106307_caseD_63;
    case 0x20:
      uVar21 = uVar21 | 1;
      uVar10 = (ulong)uVar22 | (ulong)(uVar32 << 0x10) | uVar10 & 0xffff00000000 | uVar33 << 0x30;
      goto LAB_00108bb4;
    case 0x21:
      uVar23 = uVar7 & 0xffff & uVar23;
      goto LAB_00107ad9;
    case 0x2e:
switchD_001068f3_caseD_3e:
      uVar25 = (uint)((uVar20 & 0xffff00ff) >> 0x17) & 1 | uVar11 & 0x5c;
      uVar36 = (uint)(uVar19 >> 0xf);
      uVar16 = uVar36 & 0xfe | uVar28 & 1;
      lVar27 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)(uVar16 << 0x10);
      uVar16 = (uVar36 & 0x80) + (uint)(uVar16 == 0) * 2;
      goto LAB_0010695d;
    case 0x2f:
      goto switchD_001068f3_caseD_3b;
    case 0x31:
      if (cVar8 == '\0') {
        uVar10 = 0xffffff0000ffff00;
        goto LAB_00107a04;
      }
      break;
    case 0x39:
    case 0x3d:
      goto switchD_00106167_caseD_39;
    case 0x40:
      uVar10 = uVar10 & 0xffffffff00000000;
      uVar20 = (ulong)((uVar14 >> 0x18 | uVar36 & 0xff00) << 0x10);
      goto LAB_001067c0;
    case 0x41:
      uVar23 = uVar7 & 0xffff ^ uVar23;
LAB_00107ad9:
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | (ulong)(uVar23 & 0xff) << 0x20;
      uVar20 = (ulong)((uVar23 & 0x80 | uVar11 & 0x5d) + (uint)((uVar23 & 0xff) == 0) * 2 + 0x20) <<
               0x28;
      uVar34 = 0xffff00ffffff0000;
LAB_00107b12:
      uVar10 = uVar10 & uVar34;
LAB_00106125:
      uVar10 = uVar10 | uVar20;
LAB_00106128:
      uVar20 = (ulong)uVar22;
      goto LAB_0010612a;
    case 0x4e:
switchD_00106307_caseD_5e:
      uVar12 = (uVar20 & 0xffff00ff) >> 1;
      uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)((uint)uVar12 & 0x7f0000) + 2;
      uVar20 = (ulong)((uVar7 & 1 | uVar11 & 0x5c) + (uint)((uVar12 & 0x7f0000) == 0) * 2);
      goto LAB_0010695f;
    case 0x4f:
switchD_00106307_caseD_5b:
      uVar36 = uVar7 & 1 | uVar11 & 0x5c;
      uVar16 = (uint)((uVar20 & 0xffff00ff) >> 1);
      goto LAB_00106659;
    case 0x51:
      if (cVar8 == '\0') {
        uVar10 = uVar19 << 0x10 ^ uVar19;
        goto LAB_00107b34;
      }
      break;
    case 0x59:
    case 0x5d:
      goto switchD_00106167_caseD_59;
    case 0x60:
      uVar10 = uVar10 & 0xffffffff00000000;
      uVar20 = (ulong)((uVar14 >> 0x18 | uVar36 & 0xff00) * 0x10000 + 0x10000);
LAB_001067c0:
      uVar10 = uVar22 | uVar10 | uVar20;
      goto LAB_00108bb4;
    case 0x61:
      uVar16 = (uVar29 & 1) + (uVar7 & 0xff) + (uVar23 & 0xff);
      uVar21 = uVar20 & 0xffffff00ffff0000 | uVar34 | (ulong)(uVar16 & 0xff) << 0x20;
      uVar20 = (ulong)((uVar16 & 0x80 | uVar11 & 0x1c | uVar16 >> 8 & 1) +
                       (uint)((uVar16 & 0xff) == 0) * 2 +
                       (((uVar23 ^ uVar16) & (uVar7 & 0xffff ^ uVar16)) >> 1 & 0x40) + 0x20);
      goto LAB_0010674c;
    case 0x6c:
switchD_001064bd_caseD_20:
      uVar21 = uVar20 & 0xffffffffffff0000 | uVar34;
      uVar18 = (ulong)(uVar14 >> 0x18 | uVar36 & 0xff00);
      goto switchD_00106307_caseD_5c;
    case 0x6e:
switchD_00106167_caseD_6e:
      uVar36 = (uVar11 & 1) << 7;
      uVar16 = (uint)((uVar20 & 0xffff00ff) >> 0x11) & 0x7f | uVar36;
      uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)(uVar16 << 0x10) + 2;
      uVar16 = (uVar7 & 1 | uVar28 & 0x5c) + (uint)(uVar16 == 0) * 2;
      goto LAB_00107201;
    case 0x6f:
      goto switchD_00106167_caseD_6f;
    case 0x71:
      if (cVar8 == '\0') {
        uVar25 = (uVar29 & 1) + (uVar7 & 0xffff) + (uVar23 & 0xff);
        uVar23 = ((uVar23 ^ uVar25) & (uVar7 & 0xffff ^ uVar25)) >> 1 & 0x40;
        uVar36 = uVar25 >> 8 & 1;
        uVar16 = uVar25 & 0xff;
        uVar21 = (ulong)uVar16 << 0x20;
        uVar10 = 0xffffff0000ffff00;
        goto LAB_00107289;
      }
      break;
    case 0x79:
    case 0x7d:
      goto switchD_00106167_caseD_79;
    case 0x91:
      uVar21 = (ulong)(uVar24 + (uVar15 & 0xff00));
      uVar34 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)(uVar15 & 0xff0000) + 2;
      goto LAB_00107cef;
    case 0x93:
      uVar16 = uVar23;
      if ((bVar38 & 1) == 0) {
        uVar16 = uVar23 & bVar5 + 1;
      }
      uVar16 = uVar23 >> 8 & uVar16;
      uVar12 = (ulong)(uVar16 << 8 | uVar24 & 0xff);
      if (cVar8 == '\0') {
        uVar12 = uVar26;
      }
      uVar34 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)((uVar16 & 0xff) << 0x10) + 2;
      goto LAB_001086ac;
    }
LAB_00107c36:
    uVar21 = uVar21 | 1;
    uVar10 = ((ulong)uVar22 | uVar10 & 0xffffffffffff0000) + 0x100000000000000;
    goto LAB_00108bb4;
  case 5:
    uVar21 = uVar20 & 0xffffffffffff0000 | uVar34;
    if (0x70 < uVar40) {
      if (uVar40 < 0xdb) {
        if (uVar40 < 0xb1) {
          if (0x7a < uVar40) {
            if (uVar40 != 0x7b) {
              if (uVar40 == 0x7e) goto switchD_00106167_caseD_6e;
              if (uVar40 != 0x7f) goto switchD_00106307_caseD_5c;
            }
switchD_00106167_caseD_6f:
            uVar16 = (uVar11 & 1) << 7 | (uint)((uVar20 & 0xffff00ff) >> 0x11) & 0x7f;
            uVar21 = (ulong)(uVar16 << 0x10);
            uVar34 = uVar20 & 0xffffff00ff000000 | uVar34;
            goto LAB_0010659f;
          }
          if (uVar40 == 0x71) goto switchD_00106167_caseD_79;
          if (uVar40 == 0x73) goto switchD_00106307_caseD_63;
        }
        else {
          if (0xc2 < uVar40) {
            if (uVar40 != 0xc3) {
              if (uVar40 == 0xd1) goto switchD_0010646c_caseD_d9;
              if (uVar40 != 0xd3) goto switchD_00106307_caseD_5c;
            }
            goto switchD_00106307_caseD_63;
          }
          if (uVar40 == 0xb1) goto switchD_0010646c_caseD_b9;
          if (uVar40 == 0xb3) goto switchD_0010646c_caseD_bf;
        }
      }
      else if (uVar40 < 0xf3) {
        switch(uVar40) {
        case 0xdb:
        case 0xdf:
          goto switchD_001066ec_caseD_db;
        case 0xdc:
        case 0xdd:
        case 0xe0:
        case 0xe1:
        case 0xe2:
          break;
        case 0xde:
          goto switchD_001066ec_caseD_de;
        case 0xe3:
          goto switchD_00106307_caseD_63;
        default:
          if (uVar40 == 0xf1) goto switchD_0010646c_caseD_f9;
        }
      }
      else if (uVar40 < 0xfe) {
        if (uVar40 == 0xf3) goto switchD_00106307_caseD_63;
        if (uVar40 == 0xfb) {
switchD_0010646c_caseD_ef:
          uVar21 = (ulong)(uVar14 + 0x10000 & 0xff0000);
          uVar34 = uVar20 & 0xffffff00ff000000 | uVar34;
          goto LAB_00106a37;
        }
      }
      else {
        if (uVar40 == 0xfe) goto switchD_0010646c_caseD_ee;
        if (uVar40 == 0xff) goto switchD_0010646c_caseD_ef;
      }
      goto switchD_00106307_caseD_5c;
    }
    if (uVar40 < 0x33) {
      if (uVar40 < 0x13) {
        if (uVar22 >> 8 == 0) {
          uVar21 = uVar21 | 1;
          uVar10 = (ulong)uVar22 +
                   (uVar10 & 0xffff00000000) + (uVar10 & 0xffff000000000000 | 0xffffffff0000) +
                   (ulong)(uVar14 & 0xff0000) + 0x10000;
          goto LAB_00108bb4;
        }
        if (uVar40 == 3) goto switchD_00106307_caseD_63;
        if (uVar40 == 0x11) goto switchD_00106167_caseD_19;
      }
      else {
        switch(uVar40) {
        case 0x1b:
        case 0x1f:
          goto switchD_001064bd_caseD_1b;
        case 0x1c:
        case 0x1d:
        case 0x21:
        case 0x22:
          break;
        case 0x1e:
          goto switchD_001064bd_caseD_1e;
        case 0x20:
          goto switchD_001064bd_caseD_20;
        case 0x23:
          goto switchD_00106307_caseD_63;
        default:
          if (uVar40 == 0x13) goto switchD_00106307_caseD_63;
          if (uVar40 == 0x31) goto switchD_00106167_caseD_39;
        }
      }
    }
    else if (uVar40 < 0x51) {
      switch(uVar40) {
      case 0x3b:
      case 0x3f:
        goto switchD_001068f3_caseD_3b;
      case 0x3c:
      case 0x3d:
      case 0x40:
      case 0x41:
      case 0x42:
        break;
      case 0x3e:
        goto switchD_001068f3_caseD_3e;
      case 0x43:
switchD_00106307_caseD_63:
        uVar21 = uVar20 & 0xffffffffffff0000 | uVar34 | 2;
        goto switchD_00106167_caseD_3;
      default:
        if (uVar40 == 0x33) goto switchD_00106307_caseD_63;
      }
    }
    else {
      switch(uVar40) {
      case 0x5b:
      case 0x5f:
        goto switchD_00106307_caseD_5b;
      case 0x5c:
      case 0x5d:
      case 0x60:
      case 0x61:
      case 0x62:
        break;
      case 0x5e:
        goto switchD_00106307_caseD_5e;
      case 99:
        goto switchD_00106307_caseD_63;
      default:
        if (uVar40 == 0x51) goto switchD_00106167_caseD_59;
        if (uVar40 == 0x53) goto switchD_00106307_caseD_63;
      }
    }
    goto switchD_00106307_caseD_5c;
  case 6:
    if (uVar40 < 0x53) {
      if (uVar40 < 0x23) {
        if (uVar22 >> 8 == 0) {
          uVar33 = (ulong)(uVar32 | uVar36 & 0xff00);
          bVar37 = 0;
        }
        else if ((uVar40 == 3) || (uVar40 == 0x13)) goto switchD_001064bd_caseD_1b;
      }
      else {
        if ((uVar40 == 0x23) || (uVar40 == 0x33)) goto switchD_001068f3_caseD_3b;
        if (uVar40 == 0x43) goto switchD_00106223_caseD_47;
      }
    }
    else if (uVar40 < 0xc3) {
      if (uVar40 == 0x53) goto switchD_00106223_caseD_47;
      if ((uVar40 == 99) || (uVar40 == 0x73)) goto switchD_00106223_caseD_67;
    }
    else if (uVar40 < 0xe3) {
      if ((uVar40 == 0xc3) || (uVar40 == 0xd3)) goto switchD_00106223_caseD_c7;
    }
    else if ((uVar40 == 0xe3) || (uVar40 == 0xf3)) goto switchD_00106223_caseD_e7;
    goto switchD_00106223_caseD_2;
  }
  switch(uVar40) {
  case 0:
    uVar26 = uVar20 & 0xffffffffff0000ff | uVar34;
    uVar21 = (ulong)((uVar11 & 0xef) << 0x10) | 0x100000;
    uVar18 = (ulong)(uint)((int)(uVar12 & 0xff) << 0x10);
    if ((uVar4 & 0xff000000) == 0xfc000000) {
      uVar18 = uVar21;
    }
    if (uVar14 < 0x1000000) {
      uVar18 = uVar21;
    }
    uVar21 = uVar18 | uVar26;
    if ((uVar39 >> 8 & 0x20) == 0) {
      if (cVar8 == '\0' || (uVar34 & 0x1000) != 0) {
        uVar21 = uVar18 | uVar20 & 0xffffffff000000ff | uVar34 | 0xfe000000;
      }
    }
    else {
      uVar21 = (uVar18 | uVar26 & 0xffffffff00ffd7ff) + 0xfa000000;
    }
    uVar10 = (ulong)uVar22 |
             (ulong)(uVar16 & 0xffff0000) |
             uVar10 + 0xff00000000 & 0xff00000000 |
             (uVar12 & 0xff) << 0x28 | (uVar31 & 0xff) << 0x30 | 0x100000000000000;
    goto LAB_00108bb4;
  case 1:
  case 3:
  case 0x21:
  case 0x23:
  case 0x41:
  case 0x43:
  case 0x61:
  case 99:
  case 0xa1:
  case 0xa3:
  case 0xc1:
  case 0xc3:
  case 0xe1:
  case 0xe3:
    goto switchD_00106223_caseD_1;
  default:
    goto switchD_00106223_caseD_2;
  case 6:
  case 0x16:
    uVar16 = uVar14 * 2 & 0xfe0000;
    uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)uVar16 + 2;
    uVar20 = (ulong)((uVar14 >> 0xf & 0x80) + (uint)(uVar16 == 0) * 2 |
                    (uint)((uVar20 & 0xffff00ff) >> 0x17) & 1 | uVar11 & 0x5c);
    goto LAB_0010888e;
  case 7:
  case 0x17:
switchD_001064bd_caseD_1b:
    uVar36 = (uint)((uVar20 & 0xffff00ff) >> 0x17) & 1 | uVar11 & 0x5c;
    uVar21 = (ulong)(uVar14 * 2 & 0xfe0000);
    uVar20 = uVar20 & 0xffffffffff000000 | uVar34 | uVar21 << 0x10;
    lVar27 = uVar21 + uVar20;
    uVar16 = ((uint)(uVar20 >> 0x20) & 0x80) + (uint)((char)(uVar20 >> 0x20) == '\0') * 2;
    goto LAB_00106695;
  case 0xd:
  case 0x15:
    goto switchD_00106223_caseD_d;
  case 0xe:
  case 0xf:
  case 0x2e:
  case 0x2f:
  case 0x4e:
  case 0x4f:
  case 0x6e:
  case 0x6f:
  case 0xce:
  case 0xcf:
  case 0xee:
  case 0xef:
    goto switchD_00106223_caseD_e;
  case 0x11:
  case 0x13:
  case 0x31:
  case 0x33:
  case 0x51:
  case 0x53:
  case 0x71:
  case 0x73:
  case 0x91:
  case 0x93:
  case 0xb1:
  case 0xb3:
  case 0xd1:
  case 0xd3:
  case 0xf1:
  case 0xf3:
    goto switchD_00106223_caseD_11;
  case 0x19:
  case 0x1d:
    if (cVar8 == '\0') {
      uVar10 = uVar19 << 0x10 | uVar19;
LAB_001074e8:
      uVar20 = 0xffffff0000ffffff;
LAB_00107b4b:
      uVar12 = (ulong)((uint)(uVar10 >> 0x20) & 0x80 | uVar11 & 0x5d) +
               (ulong)((uVar10 & 0xff00000000) == 0) * 2 + 0x20;
      uVar21 = uVar20 & uVar19 | uVar10 & 0xff00000000;
      goto switchD_00106307_caseD_5c;
    }
    break;
  case 0x1b:
  case 0x1e:
  case 0x1f:
  case 0x3b:
  case 0x3e:
  case 0x3f:
  case 0x5b:
  case 0x5e:
  case 0x5f:
  case 0x7b:
  case 0x7e:
  case 0x7f:
  case 0xdb:
  case 0xde:
  case 0xdf:
  case 0xfb:
  case 0xfe:
  case 0xff:
    uVar21 = (uVar20 & 0xffffffffffff0000 | uVar34) + 1;
    uVar10 = uVar10 & 0xffffffff0000 | (ulong)(uVar24 + (uVar14 >> 0x10 & 0xff00)) << 0x30;
    goto LAB_0010653f;
  case 0x1c:
  case 0x3c:
  case 0x5c:
  case 0x7c:
  case 0xdc:
  case 0xfc:
    if (cVar8 != '\0') break;
    goto switchD_00106223_caseD_2;
  case 0x20:
    uVar21 = uVar10;
    goto LAB_001080ca;
  case 0x26:
  case 0x36:
    uVar36 = (uint)(uVar19 >> 0xf);
    uVar16 = uVar36 & 0xfe | uVar29 & 1;
    uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)(uVar16 << 0x10) + 2;
    uVar20 = (ulong)((uVar36 & 0x80) + (uint)(uVar16 == 0) * 2 |
                    (uint)((uVar20 & 0xffff00ff) >> 0x17) & 1 | uVar11 & 0x5c);
LAB_0010888e:
    uVar20 = uVar10 & 0xffff00ffffff0000 | uVar20 << 0x28;
    goto LAB_00108ba4;
  case 0x27:
  case 0x37:
switchD_001068f3_caseD_3b:
    uVar25 = (uint)((uVar20 & 0xffff00ff) >> 0x17) & 1 | uVar11 & 0x5c;
    uVar16 = (uint)((uVar20 & 0xffff00ff) >> 0xf) & 0xfe | uVar11 & 1;
    uVar19 = ((ulong)uVar16 << 0x20) - 0xff00ff0100 & uVar19;
    lVar27 = uVar19 + (uVar16 << 0x10);
    uVar16 = ((uint)(uVar19 >> 0x20) & 0x80) + (uint)((char)(uVar19 >> 0x20) == '\0') * 2;
LAB_0010695d:
    uVar21 = lVar27 + 2;
    uVar20 = (ulong)(uVar16 | uVar25);
    goto LAB_0010695f;
  case 0x2c:
    goto switchD_00106223_caseD_2c;
  case 0x2d:
  case 0x35:
    goto switchD_00106223_caseD_2d;
  case 0x39:
  case 0x3d:
    if (cVar8 == '\0') {
      uVar10 = 0xffffff0000ffffff;
LAB_00107a04:
      uVar23 = uVar7 & 0xffff & uVar23;
      uVar21 = uVar10 & uVar19 | (ulong)uVar23 << 0x20;
      uVar16 = uVar23;
      goto LAB_0010846f;
    }
    break;
  case 0x40:
  case 0x60:
    uVar12 = (ulong)(uVar25 + 1 & 0xff);
    uVar21 = (ulong)((uVar14 & 0xff0000) << 8) + (uVar20 & 0xffffffff00ff0000 | uVar34) + 1;
    uVar10 = (ulong)uVar22 |
             (ulong)(uVar16 & 0xffff0000) |
             uVar12 << 0x20 | uVar10 & 0xff0000000000 | uVar12 << 0x30 | 0x100000000000000;
    goto LAB_00108bb4;
  case 0x46:
  case 0x56:
    uVar16 = uVar14 >> 1 & 0x7f0000;
    uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + 2 + (ulong)uVar16;
    uVar20 = (ulong)((uVar7 & 1 | uVar11 & 0x5c) + (uint)(uVar16 == 0) * 2);
LAB_0010695f:
    uVar10 = uVar10 & 0xffff00ffffff0000 | uVar20 << 0x28;
LAB_00107217:
    uVar10 = uVar22 | uVar10 | 0x200000000000;
    goto LAB_00108bb4;
  case 0x47:
  case 0x57:
switchD_00106223_caseD_47:
    uVar36 = uVar7 & 1 | uVar11 & 0x5c;
    uVar16 = (uint)((uVar20 & 0xffff00ff) >> 1);
LAB_00106659:
    uVar21 = (ulong)(uVar16 & 0x7f0000) << 0x10;
    lVar27 = (ulong)(uVar16 & 0x7f0000) +
             (uVar21 ^ uVar20 & 0xff00000000 | uVar20 & 0xffffff00ff000000 | uVar34);
    uVar16 = (uVar23 & 0x80) + (uint)((uVar20 & 0xff00000000) == uVar21) * 2;
LAB_00106695:
    uVar21 = lVar27 + 2;
    uVar16 = uVar16 | uVar36;
LAB_00106697:
    uVar10 = (ulong)uVar22 | uVar10 & 0xffff00ffffff0000 | (ulong)uVar16 << 0x28 | 0x200000000000;
    goto LAB_00108bb4;
  case 0x4d:
  case 0x55:
    goto switchD_00106223_caseD_4d;
  case 0x59:
  case 0x5d:
    if (cVar8 == '\0') {
      uVar10 = uVar19 << 0x10 ^ uVar19;
      goto LAB_001074e8;
    }
    break;
  case 0x66:
  case 0x76:
    uVar36 = (uVar11 & 1) << 7;
    uVar16 = uVar14 >> 0x11 & 0x7f | uVar36;
    uVar21 = (ulong)(uVar16 << 0x10) + 2 + (uVar20 & 0xffffffffff000000 | uVar34);
    uVar16 = (uVar7 & 1 | uVar28 & 0x5c) + (uint)(uVar16 == 0) * 2;
LAB_00107201:
    uVar16 = uVar16 | uVar36;
    goto LAB_00107203;
  case 0x67:
  case 0x77:
switchD_00106223_caseD_67:
    uVar21 = uVar20 & 0xffffff00ff000000 | uVar34;
    uVar16 = (uVar11 & 1) << 7 | (uint)((uVar20 & 0xffff00ff) >> 0x11) & 0x7f;
    uVar34 = (ulong)(uVar16 << 0x10);
LAB_0010659f:
    uVar16 = (uVar23 & 0xff) + uVar16 + (uint)((uVar14 >> 0x10 & 1) != 0);
    lVar27 = (ulong)(uVar16 & 0xff) << 0x20;
    lVar1 = lVar27 + (uVar34 | uVar21);
    lVar27 = lVar27 + (uVar34 | uVar21);
    uVar16 = (uVar16 >> 8 & 1 | uVar11 & 0x1c |
              ((uVar23 ^ uVar16) & (uVar11 << 7 ^ uVar16)) >> 1 & 0x40 |
             (uint)((ulong)lVar1 >> 0x20) & 0x80) + (uint)((char)((ulong)lVar1 >> 0x20) == '\0') * 2
             + 0x20;
    goto LAB_00106ab3;
  case 0x6c:
    uVar21 = (ulong)(uVar24 + 1 & 0xff | uVar3 & 0xff00);
    uVar34 = (ulong)((uVar14 & 0xff0000) << 8) + (uVar20 & 0xffffffff00ff0000 | uVar34) + 1;
    goto LAB_00107cef;
  case 0x6d:
  case 0x75:
    goto switchD_00106223_caseD_6d;
  case 0x79:
  case 0x7d:
    if (cVar8 == '\0') {
      uVar25 = (uVar29 & 1) + (uVar7 & 0xffff) + (uVar23 & 0xff);
      uVar36 = (uVar23 ^ uVar25) & (uVar7 & 0xffff ^ uVar25);
      uVar10 = 0xffffff0000ffff00;
      goto LAB_00107282;
    }
    break;
  case 0x81:
    goto switchD_00106223_caseD_81;
  case 0x83:
    goto switchD_00106223_caseD_83;
  case 0x99:
  case 0x9d:
    uVar21 = (ulong)(uVar24 + (uVar15 & 0xff00));
    uVar34 = (ulong)(uVar15 & 0xff0000) + (uVar20 & 0xffffffffff000000 | uVar34) + 2;
LAB_00107cef:
    uVar10 = uVar10 & 0xffffffff0000 | uVar21 << 0x30;
    goto LAB_001069d9;
  case 0x9b:
    uVar23 = uVar23 >> 8 & uVar23;
    uVar36 = (-(uint)((bVar38 & 1) != 0) | bVar5 + 1) & uVar23;
    lVar27 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)((uVar36 & 0xff) << 0x10);
    uVar20 = (ulong)(uVar36 << 8 | uVar24 & 0xff);
    if (cVar8 == '\0') {
      uVar20 = uVar26;
    }
    uVar10 = (ulong)(uVar16 & 0xffff0000) |
             (ulong)(uVar23 & 0xff) << 0x20 | uVar10 & 0xff0000000000 | uVar20 << 0x30 |
             (ulong)uVar22;
LAB_00106e8c:
    uVar21 = lVar27 + 2;
    goto LAB_00108bb4;
  case 0x9c:
    iVar9 = 0x30;
    goto LAB_00107ffc;
  case 0x9e:
    iVar9 = 0x28;
LAB_00107ffc:
    uVar16 = (uint)(uVar19 >> iVar9) & (-(uint)((bVar38 & 1) != 0) | bVar5 + 1);
    uVar21 = (ulong)(uVar16 << 8 | uVar24 & 0xff);
    if (cVar8 == '\0') {
      uVar21 = uVar26;
    }
    uVar10 = (ulong)uVar22 | uVar10 & 0xffffffff0000 | uVar21 << 0x30;
    uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + (ulong)((uVar16 & 0xff) << 0x10) + 2;
    goto LAB_00108bb4;
  case 0x9f:
    uVar16 = uVar23;
    if ((bVar38 & 1) == 0) {
      uVar16 = uVar23 & bVar5 + 1;
    }
    uVar16 = uVar23 >> 8 & uVar16;
    uVar21 = uVar20 & 0xffffffffff000000 | uVar34 | (ulong)((uVar16 & 0xff) << 0x10) | 2;
    uVar20 = (ulong)(uVar16 << 8 | uVar24 & 0xff);
    if (cVar8 == '\0') {
      uVar20 = uVar26;
    }
    uVar10 = uVar10 & 0xffffffff0000 | uVar20 << 0x30;
LAB_0010653f:
    uVar20 = (ulong)uVar22;
LAB_00106541:
    uVar10 = uVar10 | uVar20;
    goto LAB_00108bb4;
  case 0xac:
    goto switchD_00106223_caseD_ac;
  case 0xad:
    goto switchD_00106223_caseD_ad;
  case 0xae:
    goto switchD_00106223_caseD_ae;
  case 0xaf:
    goto switchD_00106223_caseD_af;
  case 0xb9:
  case 0xbd:
    if (cVar8 == '\0') {
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar21 = uVar10 << 0x10;
      uVar20 = 0xffffff0000ffff00;
      goto LAB_001076ca;
    }
    break;
  case 0xbb:
    if (cVar8 == '\0') {
      uVar25 = uVar25 & uVar7 & 0xffff;
      uVar31 = (ulong)uVar25;
      uVar12 = (ulong)((uVar25 & 0x80 | uVar11 & 0x5d) + (uint)(uVar25 == 0) * 2 + 0x20);
      uVar21 = (uVar31 & 0xff) << 0x20 | uVar31 << 0x28 | uVar20 & 0xffff000000ff00ff | uVar34;
      goto switchD_00106307_caseD_5c;
    }
    break;
  case 0xbc:
    if (cVar8 != '\0') break;
    uVar21 = uVar20 & 0xff00ffff00ff00ff | uVar34 | (uVar20 & 0xff0000) << 0x20;
    lVar27 = (ulong)(uVar11 & 0x5d) + (ulong)(uVar19 << 0x20 < 0x1000000000000) * 2;
    goto LAB_00108c63;
  case 0xbe:
    if (cVar8 == '\0') {
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar21 = uVar10 << 0x18;
      uVar20 = 0xffff00ff00ffffff;
      goto LAB_001076ca;
    }
    break;
  case 0xbf:
    if (cVar8 == '\0') {
      uVar10 = (ulong)(uVar4 & 0xff0000);
      uVar20 = uVar10 << 0x10;
      uVar21 = 0xffff000000ffffff;
      goto LAB_00108c3a;
    }
    break;
  case 0xc6:
  case 0xd6:
    uVar19 = uVar19 + 0xff0000;
    uVar12 = uVar19 & 0xff0000;
    goto LAB_001071af;
  case 199:
  case 0xd7:
switchD_00106223_caseD_c7:
    lVar27 = (uVar20 & 0xffffffffff000000 | uVar34) + (uVar19 + 0xff0000 & 0xff0000);
    uVar16 = (uVar23 & 0xff) - ((uint)(uVar19 + 0xff0000 >> 0x10) & 0xff);
LAB_00106723:
    uVar21 = lVar27 + 2;
    uVar16 = (uVar16 & 0x80 | uVar11 & 0x5c | uVar16 >> 8 & 1) + (uint)((char)uVar16 == '\0') * 2;
LAB_00106749:
    uVar20 = (ulong)(uVar16 ^ 0x21);
    goto LAB_0010674c;
  case 0xcc:
    goto switchD_00106223_caseD_cc;
  case 0xcd:
  case 0xd5:
    goto switchD_00106223_caseD_cd;
  case 0xd9:
  case 0xdd:
    if (cVar8 != '\0') break;
    uVar16 = (uVar17 & 0xff) - (uVar7 & 0xffff);
    cVar8 = (char)uVar16;
    uVar16 = uVar16 & 0x80 | uVar11 & 0x5c | uVar16 >> 8 & 1;
    goto LAB_00107617;
  case 0xe6:
  case 0xf6:
    uVar19 = uVar19 + 0x10000;
    uVar12 = (ulong)((uint)uVar19 & 0xff0000);
LAB_001071af:
    uVar21 = (uVar20 & 0xffffffffff000000 | uVar34) + uVar12 + 2;
    goto LAB_001082d2;
  case 0xe7:
  case 0xf7:
switchD_00106223_caseD_e7:
    uVar21 = uVar20 & 0xffffff00ff000000 | uVar34;
    uVar34 = (ulong)(uVar14 + 0x10000 & 0xff0000);
LAB_00106a37:
    uVar36 = ~(uVar14 + 0x10000) >> 0x10;
    uVar16 = (uVar28 & 1) + (uVar23 & 0xff) + (uVar36 | 0xffffff00);
    lVar27 = ((ulong)(uVar16 & 0xff) << 0x20) + (uVar34 | uVar21);
    uVar16 = ((uVar16 & 0x80 | uVar11 & 0x1c | uVar16 >> 8 & 1) + (uint)((uVar16 & 0xff) == 0) * 2 |
             ((uVar23 ^ uVar16) & (uVar36 ^ uVar16)) >> 1 & 0x40) ^ 0x21;
LAB_00106ab3:
    uVar10 = (ulong)uVar22 | uVar10 & 0xffff00ffffff0000 | (ulong)uVar16 << 0x28;
    uVar21 = lVar27 + 2;
    goto LAB_00108bb4;
  case 0xec:
    goto switchD_00106223_caseD_ec;
  case 0xed:
  case 0xf5:
    goto switchD_00106223_caseD_ed;
  case 0xf9:
  case 0xfd:
    if (cVar8 == '\0') {
      uVar36 = (uVar29 & 1) + ~(uVar7 & 0xffff) + (uVar23 & 0xff);
      uVar16 = (uVar23 ^ uVar36) & (~(uVar7 & 0xffff) ^ uVar36);
      uVar10 = 0xffffff0000ffffff;
LAB_00107845:
      uVar21 = uVar10 & uVar19 | (ulong)(uVar36 & 0xff) << 0x20;
      uVar36 = (uVar36 & 0x80 | uVar11 & 0x1c | uVar36 >> 8 & 1) + (uint)((uVar36 & 0xff) == 0) * 2;
      goto LAB_0010705c;
    }
  }
  uVar10 = ((ulong)uVar22 | uVar10 & 0xffffffffffff0000) + 0x100000000000000;
  uVar21 = (uVar20 & 0xffffffffffff0000 | uVar34) + 1;
LAB_00108bb4:
  cVar41.rw_mode = (char)uVar21;
  cVar41._9_1_ = (char)(uVar21 >> 8);
  cVar41.data = (char)(uVar21 >> 0x10);
  cVar41.temp = (char)(uVar21 >> 0x18);
  cVar41.A = (char)(uVar21 >> 0x20);
  cVar41.X = (char)(uVar21 >> 0x28);
  cVar41.Y = (char)(uVar21 >> 0x30);
  cVar41._15_1_ = (char)(uVar21 >> 0x38);
  cVar41.cycle = (short)uVar10;
  cVar41.PC = (short)(uVar10 >> 0x10);
  cVar41.S = (char)(uVar10 >> 0x20);
  cVar41.P = (char)(uVar10 >> 0x28);
  cVar41.address = (short)(uVar10 >> 0x30);
  return cVar41;
}

Assistant:

static cpu_state cpu_execute(cpu_state state)
{
    if (!state.rdy && state.rw_mode != CPU_RW_MODE_WRITE)
    {
        state.halted = 1;
        return state;
    }

    int was_halted = state.halted;
    state.halted = 0;

    int irq_phase1 = state.irq_phase0;
    state.irq_phase0 = state.irq && !(state.P & CPU_STATUS_FLAG_IRQDISABLE);

    int nmi_phase1 = state.nmi_phase0;
    if (state.nmi_phase0 == 0 && state.nmi)
        state.nmi_phase0 = 1;

    uint8_t cycle = (uint8_t)state.cycle++;
    uint_fast32_t instruction = _CPU_GET_INSTRUCTION(state);

    if (cycle == 0)
    {
        _CPU_SET_INSTRUCTION(state, state.data);
        state.rw_mode = CPU_RW_MODE_NONE;

        switch (state.data)
        {
            case IC_INX: _CPU_SET_REG_X(state, state.X + 1); return state;
            case IC_INY: _CPU_SET_REG_Y(state, state.Y + 1); return state;
            case IC_DEX: _CPU_SET_REG_X(state, state.X - 1); return state;
            case IC_DEY: _CPU_SET_REG_Y(state, state.Y - 1); return state;
            case IC_ROL_ACC: _CPU_ROL(state, state.A); return state;
            case IC_ROR_ACC: _CPU_ROR(state, state.A); return state;
            case IC_ASL_ACC: _CPU_ASL(state, state.A); return state;
            case IC_LSR_ACC: _CPU_LSR(state, state.A); return state;
            case IC_TAX: _CPU_SET_REG_X(state, state.A); return state;
            case IC_TAY: _CPU_SET_REG_Y(state, state.A); return state;
            case IC_TSX: _CPU_SET_REG_X(state, state.S); return state;
            case IC_TXA: _CPU_SET_REG_A(state, state.X); return state;
            case IC_TXS: _CPU_SET_REG_S(state, state.X); return state;
            case IC_TYA: _CPU_SET_REG_A(state, state.Y); return state;
            case IC_CLC: _CPU_SET_REG_P(state, state.P & 0xFE); return state;
            case IC_SEC: _CPU_SET_REG_P(state, state.P | 1); return state;
            case IC_CLI: _CPU_SET_REG_P(state, state.P & 0xFB); return state;
            case IC_SEI: _CPU_SET_REG_P(state, state.P | 0x04); return state;
            case IC_CLV: _CPU_SET_REG_P(state, state.P & 0xBF); return state;
            case IC_CLD: _CPU_SET_REG_P(state, state.P & 0xF7); return state;
            case IC_SED: _CPU_SET_REG_P(state, state.P | 0x08); return state;
            case IC_NOP: 
            case IC_IL_NOP_IMM0: case IC_IL_NOP_IMM1: case IC_IL_NOP_IMM2: case IC_IL_NOP_IMM3: case IC_IL_NOP_IMM4: case IC_IL_NOP_IMM5:
                return state;

            case IC_PHP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = ((uint8_t)state.S--) + 0x0100;
                state.data = state.P | CPU_STATUS_FLAG_BREAK;
                return state;
            case IC_PHA:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = ((uint8_t)state.S--) + 0x0100;
                state.data = state.A;
                return state;
            case IC_PLP: case IC_PLA:
                state.rw_mode = CPU_RW_MODE_READ; // Dummy read
                state.address = state.PC;
                return state;

            case IC_BRK:
                if (state.temp) // Don't increment PC on hardware interrupt
                {
                    state.rw_mode = CPU_RW_MODE_READ;
                    state.address = state.PC;
                    return state;
                }

            case IC_RTS: case IC_RTI:
            case IC_BCC: case IC_BCS: case IC_BNE: case IC_BEQ: case IC_BVC: case IC_BVS: case IC_BPL: case IC_BMI:
            case IC_JMP: case IC_JMP_IND:
            case IC_BIT_ABS: case IC_BIT_ZP: 
            case IC_LDA_IMM: case IC_LDA_ABS: case IC_LDA_ABS_X: case IC_LDA_ABS_Y: case IC_LDA_ZP: case IC_LDA_ZP_X: case IC_LDA_IND_X: case IC_LDA_IND_Y:
            case IC_LDX_IMM: case IC_LDX_ABS: case IC_LDX_ABS_Y: case IC_LDX_ZP: case IC_LDX_ZP_Y: 
            case IC_LDY_IMM: case IC_LDY_ABS: case IC_LDY_ABS_X: case IC_LDY_ZP: case IC_LDY_ZP_X:
            case IC_STA_ABS: case IC_STA_ABS_X: case IC_STA_ABS_Y: case IC_STA_ZP: case IC_STA_ZP_X: case IC_STA_IND_X: case IC_STA_IND_Y:
            case IC_STX_ABS: case IC_STX_ZP: case IC_STX_ZP_Y: case IC_STY_ABS: case IC_STY_ZP: case IC_STY_ZP_X:
            case IC_ROL_ABS: case IC_ROL_ABS_X: case IC_ROL_ZP: case IC_ROL_ZP_X: 
            case IC_ROR_ABS: case IC_ROR_ABS_X: case IC_ROR_ZP: case IC_ROR_ZP_X: 
            case IC_DEC_ABS: case IC_DEC_ABS_X: case IC_DEC_ZP: case IC_DEC_ZP_X:
            case IC_INC_ABS: case IC_INC_ABS_X: case IC_INC_ZP: case IC_INC_ZP_X:
            case IC_ASL_ABS: case IC_ASL_ABS_X: case IC_ASL_ZP: case IC_ASL_ZP_X: 
            case IC_LSR_ABS: case IC_LSR_ABS_X: case IC_LSR_ZP: case IC_LSR_ZP_X: 
            case IC_AND_IMM: case IC_AND_ABS: case IC_AND_ABS_X: case IC_AND_ABS_Y: case IC_AND_ZP: case IC_AND_ZP_X: case IC_AND_IND_X: case IC_AND_IND_Y:
            case IC_ORA_IMM: case IC_ORA_ABS: case IC_ORA_ABS_X: case IC_ORA_ABS_Y: case IC_ORA_ZP: case IC_ORA_ZP_X: case IC_ORA_IND_X: case IC_ORA_IND_Y:
            case IC_EOR_IMM: case IC_EOR_ABS: case IC_EOR_ABS_X: case IC_EOR_ABS_Y: case IC_EOR_ZP: case IC_EOR_ZP_X: case IC_EOR_IND_X: case IC_EOR_IND_Y:
            case IC_ADC_IMM: case IC_ADC_ABS: case IC_ADC_ABS_X: case IC_ADC_ABS_Y: case IC_ADC_ZP: case IC_ADC_ZP_X: case IC_ADC_IND_X: case IC_ADC_IND_Y:
            case IC_SBC_IMM: case IC_SBC_ABS: case IC_SBC_ABS_X: case IC_SBC_ABS_Y: case IC_SBC_ZP: case IC_SBC_ZP_X: case IC_SBC_IND_X: case IC_SBC_IND_Y:
            case IC_CMP_IMM: case IC_CMP_ABS: case IC_CMP_ABS_X: case IC_CMP_ABS_Y: case IC_CMP_ZP: case IC_CMP_ZP_X: case IC_CMP_IND_X: case IC_CMP_IND_Y:
            case IC_CPX_IMM: case IC_CPX_ABS: case IC_CPX_ZP:
            case IC_CPY_IMM: case IC_CPY_ABS: case IC_CPY_ZP:
            case IC_JSR:
            case IC_IL_ANC_IMM: case IC_IL_AAC_IMM: case IC_IL_ALR_IMM: case IC_IL_ARR_IMM: case IC_IL_AXS_IMM:
            case IC_IL_LAX_IMM: case IC_IL_LAX_ABS: case IC_IL_LAX_ABS_Y: case IC_IL_LAX_ZP: case IC_IL_LAX_ZP_Y: case IC_IL_LAX_IND_X: case IC_IL_LAX_IND_Y:
            case IC_IL_SAX_ABS: case IC_IL_SAX_ZP: case IC_IL_SAX_ZP_Y: case IC_IL_SAX_IND_X:
            case IC_IL_XAA_IMM:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHY_ABS_X: case IC_IL_SHX_ABS_Y: case IC_IL_SHA_ABS_Y: case IC_IL_SHA_IND_Y: case IC_IL_TAS_ABS_Y:
            case IC_IL_SBC_IMM:
            case IC_IL_NOP_ZP0: case IC_IL_NOP_ZP1: case IC_IL_NOP_ZP2:
            case IC_IL_NOP_ABS:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
            case IC_IL_NOP_IMP0: case IC_IL_NOP_IMP1: case IC_IL_NOP_IMP2: case IC_IL_NOP_IMP3: case IC_IL_NOP_IMP4:
            case IC_IL_DCP_ABS: case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y: case IC_IL_DCP_ZP: case IC_IL_DCP_ZP_X: case IC_IL_DCP_IND_X: case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_ABS: case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y: case IC_IL_ISB_ZP: case IC_IL_ISB_ZP_X: case IC_IL_ISB_IND_X: case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_ABS: case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y: case IC_IL_SLO_ZP: case IC_IL_SLO_ZP_X: case IC_IL_SLO_IND_X: case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_ABS: case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y: case IC_IL_RLA_ZP: case IC_IL_RLA_ZP_X: case IC_IL_RLA_IND_X: case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_ABS: case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y: case IC_IL_SRE_ZP: case IC_IL_SRE_ZP_X: case IC_IL_SRE_IND_X: case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_ABS: case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y: case IC_IL_RRA_ZP: case IC_IL_RRA_ZP_X: case IC_IL_RRA_IND_X: case IC_IL_RRA_IND_Y:

                /* fetch first operand */
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC++;
                return state;

            default: 
                // Unknown instruction, treated as NOP
                return state;
        }
    }
    else if (cycle == 1)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = state.PC >> 8;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_ADC_IMM: _CPU_ADC(state); break;
            case IC_AND_IMM: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IMM: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IMM: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_LDA_IMM: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_IMM: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_IMM: _CPU_SET_REG_Y(state, state.data); break;
            case IC_IL_LAX_IMM: _CPU_LAX(state); break;
            case IC_IL_ANC_IMM: 
            case IC_IL_AAC_IMM: _CPU_ANC(state); break;
            case IC_IL_ALR_IMM: _CPU_ALR(state); break;
            case IC_IL_ARR_IMM: _CPU_ARR(state); break;
            case IC_IL_AXS_IMM: _CPU_AXS(state); break;
            case IC_IL_XAA_IMM: _CPU_XAA(state); break;
            case IC_IL_SBC_IMM:
            case IC_SBC_IMM: _CPU_SBC(state); break;
            case IC_CMP_IMM: _CPU_CMP(state, state.A); break;
            case IC_CPX_IMM: _CPU_CMP(state, state.X); break;
            case IC_CPY_IMM: _CPU_CMP(state, state.Y); break;
            case IC_BCC:     _CPU_COND_BRANCH(state, (state.P & 0x01) == 0); break;
            case IC_BCS:     _CPU_COND_BRANCH(state, (state.P & 0x01)); break;
            case IC_BNE:     _CPU_COND_BRANCH(state, (state.P & 0x02) == 0); break;
            case IC_BEQ:     _CPU_COND_BRANCH(state, (state.P & 0x02)); break;
            case IC_BVC:     _CPU_COND_BRANCH(state, (state.P & 0x40) == 0); break;
            case IC_BVS:     _CPU_COND_BRANCH(state, (state.P & 0x40)); break;
            case IC_BPL:     _CPU_COND_BRANCH(state, (state.P & 0x80) == 0); break;
            case IC_BMI:     _CPU_COND_BRANCH(state, (state.P & 0x80)); break;
            case IC_LDA_ABS: case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
            case IC_LDX_ABS: case IC_LDX_ABS_Y:
            case IC_LDY_ABS: case IC_LDY_ABS_X:
            case IC_STA_ABS: case IC_STA_ABS_X: case IC_STA_ABS_Y:
            case IC_STX_ABS:
            case IC_STY_ABS:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHY_ABS_X: case IC_IL_SHX_ABS_Y: case IC_IL_SHA_ABS_Y: case IC_IL_TAS_ABS_Y:
            case IC_ROL_ABS: case IC_ROL_ABS_X:
            case IC_ROR_ABS: case IC_ROR_ABS_X:
            case IC_ASL_ABS: case IC_ASL_ABS_X:
            case IC_LSR_ABS: case IC_LSR_ABS_X:
            case IC_DEC_ABS: case IC_DEC_ABS_X:
            case IC_INC_ABS: case IC_INC_ABS_X:
            case IC_AND_ABS: case IC_AND_ABS_X: case IC_AND_ABS_Y:
            case IC_ORA_ABS: case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
            case IC_EOR_ABS: case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
            case IC_ADC_ABS: case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
            case IC_SBC_ABS: case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
            case IC_CMP_ABS: case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
            case IC_CPX_ABS:
            case IC_CPY_ABS:
            case IC_BIT_ABS:
            case IC_JMP: case IC_JMP_IND:
            case IC_IL_NOP_ABS:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_LAX_ABS: case IC_IL_LAX_ABS_Y:
            case IC_IL_SAX_ABS:
            case IC_IL_DCP_ABS: case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS: case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS: case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS: case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS: case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS: case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:

                /* fetch high byte of absolute address */
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC++;
                state.temp = state.data;
                return state;

            case IC_LDA_ZP:
            case IC_LDX_ZP:
            case IC_LDY_ZP:
            case IC_BIT_ZP:
            case IC_ROL_ZP:
            case IC_ROR_ZP:
            case IC_ASL_ZP:
            case IC_LSR_ZP:
            case IC_ADC_ZP:
            case IC_SBC_ZP:
            case IC_CMP_ZP:
            case IC_CPX_ZP:
            case IC_CPY_ZP:
            case IC_DEC_ZP:
            case IC_INC_ZP:
            case IC_AND_ZP:
            case IC_ORA_ZP:
            case IC_EOR_ZP:
            case IC_IL_NOP_ZP0: case IC_IL_NOP_ZP1: case IC_IL_NOP_ZP2:
            case IC_IL_LAX_ZP:
            case IC_IL_DCP_ZP:
            case IC_IL_ISB_ZP:
            case IC_IL_SLO_ZP:
            case IC_IL_RLA_ZP:
            case IC_IL_SRE_ZP:
            case IC_IL_RRA_ZP:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.data;
                return state;
            case IC_LDA_ZP_X:
            case IC_LDY_ZP_X:
            case IC_ROL_ZP_X:
            case IC_ROR_ZP_X:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP_X:
            case IC_ADC_ZP_X:
            case IC_SBC_ZP_X:
            case IC_CMP_ZP_X:
            case IC_DEC_ZP_X:
            case IC_INC_ZP_X:
            case IC_AND_ZP_X:
            case IC_ORA_ZP_X:
            case IC_EOR_ZP_X:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.X) & 0xFF;
                return state; 
            case IC_LDX_ZP_Y:
            case IC_IL_LAX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.Y) & 0xFF;
                return state;
            case IC_STA_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.A;
                return state;
            case IC_STA_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.X) & 0xFF;
                state.data = state.A;
                return state;
            case IC_STX_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.X;
                return state;
            case IC_STX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.Y) & 0xFF;
                state.data = state.X;
                return state;
            case IC_STY_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.Y;
                return state;
            case IC_STY_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.X) & 0xFF;
                state.data = state.Y;
                return state;
            case IC_IL_SAX_ZP:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = state.data;
                state.data = state.A & state.X;
                return state;
            case IC_IL_SAX_ZP_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data + state.Y) & 0xFF;
                state.data = state.A & state.X;
                return state;
            case IC_LDA_IND_X:
            case IC_STA_IND_X:
            case IC_ADC_IND_X:
            case IC_SBC_IND_X:
            case IC_CMP_IND_X:
            case IC_AND_IND_X:
            case IC_ORA_IND_X:
            case IC_EOR_IND_X:
            case IC_IL_LAX_IND_X:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X:
            case IC_IL_RLA_IND_X:
            case IC_IL_SRE_IND_X:
            case IC_IL_RRA_IND_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data + state.X) & 0xFF;
                return state;
            case IC_LDA_IND_Y:
            case IC_STA_IND_Y:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_Y:
            case IC_AND_IND_Y:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_Y:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.data;
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.temp = state.data;
                return state;
            case IC_RTS: case IC_RTI: case IC_PLA: case IC_PLP:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = ((uint8_t)++state.S) + 0x0100;
                return state;
            case IC_PHA:
            case IC_PHP:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycle
                return state;
            default:
                break;
        }
    }
    else if (cycle == 2)
    {
        switch (instruction)
        {
            case IC_BRK:
                state.data = (uint8_t)state.PC;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;

            case IC_BCC: case IC_BCS: case IC_BNE: case IC_BEQ: case IC_BVC: case IC_BVS: case IC_BPL: case IC_BMI:
                _CPU_COND_BRANCH_TAKEN(state);
                break;

            case IC_LDA_ABS:
            case IC_LDX_ABS:
            case IC_LDY_ABS:
            case IC_ROL_ABS:
            case IC_ROR_ABS:
            case IC_DEC_ABS:
            case IC_INC_ABS:
            case IC_ASL_ABS:
            case IC_LSR_ABS:
            case IC_ADC_ABS:
            case IC_SBC_ABS:
            case IC_CMP_ABS:
            case IC_CPX_ABS:
            case IC_CPY_ABS:
            case IC_AND_ABS:
            case IC_ORA_ABS:
            case IC_EOR_ABS:
            case IC_BIT_ABS:
            case IC_IL_NOP_ABS:
            case IC_IL_LAX_ABS:
            case IC_IL_DCP_ABS:
            case IC_IL_ISB_ABS:
            case IC_IL_SLO_ABS:
            case IC_IL_RLA_ABS:
            case IC_IL_SRE_ABS:
            case IC_IL_RRA_ABS:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_LDA_ABS_X:
            case IC_LDY_ABS_X:
            case IC_STA_ABS_X:
            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_ADC_ABS_X:
            case IC_SBC_ABS_X:
            case IC_CMP_ABS_X:
            case IC_AND_ABS_X:
            case IC_ORA_ABS_X:
            case IC_EOR_ABS_X:
            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
            case IC_IL_DCP_ABS_X:
            case IC_IL_ISB_ABS_X:
            case IC_IL_SLO_ABS_X:
            case IC_IL_RLA_ABS_X:
            case IC_IL_SRE_ABS_X:
            case IC_IL_RRA_ABS_X:
            case IC_IL_SHY_ABS_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.X) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.X) >> 8;
                return state;
            case IC_LDA_ABS_Y:
            case IC_LDX_ABS_Y:
            case IC_STA_ABS_Y:
            case IC_ADC_ABS_Y:
            case IC_SBC_ABS_Y:
            case IC_CMP_ABS_Y:
            case IC_AND_ABS_Y:
            case IC_ORA_ABS_Y:
            case IC_EOR_ABS_Y:
            case IC_IL_LAX_ABS_Y:
            case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS_Y:
            case IC_IL_LAS_ABS_Y:
            case IC_IL_SHX_ABS_Y:
            case IC_IL_SHA_ABS_Y:
            case IC_IL_TAS_ABS_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_STA_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A;
                return state;
            case IC_STX_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.X;
                return state;
            case IC_STY_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.Y;
                return state;
            case IC_IL_SAX_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A & state.X;
                return state;
            case IC_LDA_IND_X:
            case IC_LDA_IND_Y:
            case IC_STA_IND_X:
            case IC_STA_IND_Y:
            case IC_ADC_IND_X:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_X:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_X:
            case IC_CMP_IND_Y:
            case IC_AND_IND_X:
            case IC_AND_IND_Y:
            case IC_ORA_IND_X:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_X:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_X:
            case IC_IL_LAX_IND_Y:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.address + 1) & 0xFF;
                state.temp = state.data;
                return state;
            case IC_JMP:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = (state.data << 8) | state.temp;
                break;
            case IC_JMP_IND:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_BIT_ZP: _CPU_BIT(state); break;
            case IC_LDA_ZP: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_ZP: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_ZP: _CPU_SET_REG_Y(state, state.data); break;
            case IC_ADC_ZP: _CPU_ADC(state); break;
            case IC_SBC_ZP: _CPU_SBC(state); break;
            case IC_CMP_ZP: _CPU_CMP(state, state.A); break;
            case IC_CPX_ZP: _CPU_CMP(state, state.X); break;
            case IC_CPY_ZP: _CPU_CMP(state, state.Y); break;
            case IC_AND_ZP: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_ZP: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_ZP: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_ZP: _CPU_LAX(state); break;
            case IC_LDA_ZP_X:
                _CPU_SET_REG_A(state, state.data);
                return state; 
            case IC_LDY_ZP_X:
                _CPU_SET_REG_Y(state, state.data);
                return state;
            case IC_LDX_ZP_Y:
                _CPU_SET_REG_X(state, state.data);
                return state;
            case IC_IL_LAX_ZP_Y:
                _CPU_LAX(state);
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = (state.PC >> 8);
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_READ;
                _CPU_SET_REG_P(state, state.data & ~CPU_STATUS_FLAG_BREAK);
                state.address = ((uint8_t)++state.S) + 0x0100;
                return state;
            case IC_RTS:
                state.rw_mode = CPU_RW_MODE_NONE;
                return state;
            case IC_PLA:
                state.rw_mode = CPU_RW_MODE_NONE;
                _CPU_SET_REG_A(state, state.data);
                return state;
            case IC_PLP:
                state.rw_mode = CPU_RW_MODE_NONE;
                _CPU_SET_REG_P(state, state.data & ~CPU_STATUS_FLAG_BREAK);
                return state;

            case IC_ROL_ZP:
            case IC_ROL_ZP_X:
            case IC_ROR_ZP:
            case IC_ROR_ZP_X:
            case IC_DEC_ZP:
            case IC_DEC_ZP_X:
            case IC_INC_ZP:
            case IC_INC_ZP_X:
            case IC_ASL_ZP:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP:
            case IC_LSR_ZP_X:
            case IC_IL_SAX_ZP_Y:
            case IC_IL_DCP_ZP:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_STA_ZP_X:
            case IC_STX_ZP_Y:
            case IC_STY_ZP_X:
            case IC_ADC_ZP_X:
            case IC_SBC_ZP_X:
            case IC_CMP_ZP_X:
            case IC_AND_ZP_X:
            case IC_ORA_ZP_X:
            case IC_EOR_ZP_X:
            case IC_IL_NOP_ZP_X0: case IC_IL_NOP_ZP_X1: case IC_IL_NOP_ZP_X2: case IC_IL_NOP_ZP_X3: case IC_IL_NOP_ZP_X4: case IC_IL_NOP_ZP_X5:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycles
                return state;
            default: break;
        }
    }
    else if (cycle == 3)
    {
        switch(instruction)
        {
            case IC_BRK:
                state.data = state.P;
                if (state.temp == 0 || state.temp == 0xFC)
                    state.data |= CPU_STATUS_FLAG_BREAK;

                if (state.nmi_phase0)
                {
                    state.nmi = 0;
                    state.nmi_phase0 = 0;
                    state.temp = 0xFA;
                }
                else if (state.irq_phase0 || state.temp == 0)
                {
                    state.temp = 0xFE;
                }

                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;

            case IC_LDA_ABS: _CPU_SET_REG_A(state, state.data); break;
            case IC_LDX_ABS: _CPU_SET_REG_X(state, state.data); break;
            case IC_LDY_ABS: _CPU_SET_REG_Y(state, state.data); break;
            case IC_IL_LAX_ABS: _CPU_LAX(state); break;
            case IC_ADC_ABS: case IC_ADC_ZP_X: _CPU_ADC(state); break;
            case IC_SBC_ABS: case IC_SBC_ZP_X: _CPU_SBC(state); break;
            case IC_CMP_ABS: case IC_CMP_ZP_X: _CPU_CMP(state, state.A); break;
            case IC_CPX_ABS: _CPU_CMP(state, state.X); break;
            case IC_CPY_ABS: _CPU_CMP(state, state.Y); break;
            case IC_AND_ABS: case IC_AND_ZP_X: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_ABS: case IC_ORA_ZP_X: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_ABS: case IC_EOR_ZP_X: _CPU_SET_REG_A(state, state.A ^ state.data); break;

            case IC_IL_NOP_ABS_X0: case IC_IL_NOP_ABS_X1: case IC_IL_NOP_ABS_X2: case IC_IL_NOP_ABS_X3: case IC_IL_NOP_ABS_X4: case IC_IL_NOP_ABS_X5:
                _CPU_CHECK_PAGE_CROSS(state);
                break;

            case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.data);
                break;

            case IC_LDX_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_X(state, state.data);
                break;

            case IC_LDY_ABS_X:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_Y(state, state.data);
                break;

            case IC_IL_LAX_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_LAX(state);
                break;

            case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_ADC(state); 
                break;

            case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SBC(state); 
                break;

            case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_CMP(state, state.A);
                break;

            case IC_AND_ABS_X: case IC_AND_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A & state.data); 
                break;

            case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A | state.data); 
                break;

            case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_SET_REG_A(state, state.A ^ state.data); 
                break;

            case IC_IL_LAS_ABS_Y:
                _CPU_CHECK_PAGE_CROSS(state);
                _CPU_LAS(state);
                break;

            case IC_STA_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_STA_ABS_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y: 
            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y: 
            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y: 
            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y: 
            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y: 
            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y: 
                state.rw_mode = CPU_RW_MODE_READ;
                state.address += state.temp * 0x0100;
                return state;
            case IC_IL_SHY_ABS_X:
                _CPU_SHAXY(state, state.Y, was_halted);
                return state;
            case IC_IL_SHX_ABS_Y:
                _CPU_SHAXY(state, state.X, was_halted);
                return state;
            case IC_IL_SHA_ABS_Y:
                _CPU_SHAXY(state, (state.A & state.X), was_halted);
                return state;
            case IC_IL_TAS_ABS_Y:
                state.S = state.A & state.X;
                _CPU_SHAXY(state, state.S, was_halted);
                return state;
            case IC_ROL_ABS: 
            case IC_ROR_ABS: 
            case IC_DEC_ABS: 
            case IC_INC_ABS: 
            case IC_ASL_ABS:
            case IC_LSR_ABS: 
            case IC_IL_DCP_ABS: 
            case IC_IL_ISB_ABS: 
            case IC_IL_SLO_ABS: 
            case IC_IL_RLA_ABS: 
            case IC_IL_SRE_ABS: 
            case IC_IL_RRA_ABS: 
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_ROL_ZP: case IC_ROL_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ZP: case IC_ROR_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ZP: case IC_DEC_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ZP: case IC_INC_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ZP: case IC_ASL_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ZP: case IC_LSR_ZP_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ZP: case IC_IL_DCP_ZP_X:
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ZP: case IC_IL_ISB_ZP_X:
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ZP: case IC_IL_SLO_ZP_X:
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ZP: case IC_IL_RLA_ZP_X:
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ZP: case IC_IL_SRE_ZP_X:
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ZP: case IC_IL_RRA_ZP_X:
                _CPU_RRA(state);
                return state;

            case IC_BIT_ABS:    _CPU_BIT(state); break;

            case IC_LDA_IND_X:
            case IC_ADC_IND_X:
            case IC_SBC_IND_X:
            case IC_CMP_IND_X:
            case IC_AND_IND_X:
            case IC_ORA_IND_X:
            case IC_EOR_IND_X:
            case IC_IL_LAX_IND_X:
            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X:
            case IC_IL_RLA_IND_X:
            case IC_IL_SRE_IND_X:
            case IC_IL_RRA_IND_X:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | state.temp;
                return state;
            case IC_LDA_IND_Y:
            case IC_ADC_IND_Y:
            case IC_SBC_IND_Y:
            case IC_CMP_IND_Y:
            case IC_AND_IND_Y:
            case IC_ORA_IND_Y:
            case IC_EOR_IND_Y:
            case IC_IL_LAX_IND_Y:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
            case IC_IL_SHA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_STA_IND_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A;
                return state;
            case IC_STA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.data << 8) | ((state.temp + state.Y) & 0xFF);
                state.temp = ((uint16_t)state.temp + (uint16_t)state.Y) >> 8;
                return state;
            case IC_IL_SAX_IND_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address = (state.data << 8) | state.temp;
                state.data = state.A & state.X;
                return state;
            case IC_JMP_IND:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = (state.address & 0xFF00) | ((state.address + 1) & 0x00FF);
                state.temp = state.data;
                return state;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.data = state.PC & 0xFF;
                state.address = ((uint8_t)state.S--) + 0x0100;
                return state;
            case IC_RTS:
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = ((uint8_t)++state.S) + 0x0100;
                state.temp = state.data;
                return state;

           default: break;
        }
    }
    else if (cycle == 4)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = 0xFF00 | state.temp;
                _CPU_SET_REG_P(state, state.P | CPU_STATUS_FLAG_IRQDISABLE);
                return state;

             case IC_LDA_ABS_X: case IC_LDA_ABS_Y:
                _CPU_SET_REG_A(state, state.data);
                break;

            case IC_LDX_ABS_Y:
                _CPU_SET_REG_X(state, state.data);
                break;

            case IC_LDY_ABS_X:
                _CPU_SET_REG_Y(state, state.data);
                break;

            case IC_IL_LAX_ABS_Y:
                _CPU_LAX(state);
                break;

            case IC_ADC_ABS_X: case IC_ADC_ABS_Y:
                _CPU_ADC(state); 
                break;

            case IC_SBC_ABS_X: case IC_SBC_ABS_Y:
                _CPU_SBC(state); 
                break;

            case IC_CMP_ABS_X: case IC_CMP_ABS_Y:
                _CPU_CMP(state, state.A);
                break;

            case IC_AND_ABS_X: case IC_AND_ABS_Y:
                _CPU_SET_REG_A(state, state.A & state.data); 
                break;

            case IC_ORA_ABS_X: case IC_ORA_ABS_Y:
                _CPU_SET_REG_A(state, state.A | state.data); 
                break;

            case IC_EOR_ABS_X: case IC_EOR_ABS_Y:
                _CPU_SET_REG_A(state, state.A ^ state.data); 
                break;

            case IC_IL_LAS_ABS_Y:
                _CPU_LAS(state);
                break;

            case IC_ROL_ABS_X:
            case IC_ROR_ABS_X:
            case IC_DEC_ABS_X:
            case IC_INC_ABS_X:
            case IC_ASL_ABS_X:
            case IC_LSR_ABS_X:
            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_LDA_IND_X: _CPU_SET_REG_A(state, state.data); return state;
            case IC_ADC_IND_X: _CPU_ADC(state); return state;
            case IC_SBC_IND_X: _CPU_SBC(state); return state;
            case IC_CMP_IND_X: _CPU_CMP(state, state.A); return state;
            case IC_AND_IND_X: _CPU_SET_REG_A(state, state.A & state.data); return state;
            case IC_ORA_IND_X: _CPU_SET_REG_A(state, state.A | state.data); return state;
            case IC_EOR_IND_X: _CPU_SET_REG_A(state, state.A ^ state.data); return state;
            case IC_IL_LAX_IND_X: _CPU_LAX(state); return state;

            case IC_LDA_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.data); break;
            case IC_ADC_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_ADC(state); break;
            case IC_SBC_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SBC(state); break;
            case IC_CMP_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_CMP(state, state.A); break;
            case IC_AND_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_IND_Y: _CPU_CHECK_PAGE_CROSS(state); _CPU_LAX(state); break;

            case IC_STA_IND_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                state.address += state.temp * 0x0100;
                state.data = state.A;
                return state;

            case IC_JMP_IND:
                state.PC = (state.data << 8) | state.temp;
                break;
            case IC_JSR:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address = state.PC;
                return state;

            case IC_IL_DCP_IND_X:
            case IC_IL_ISB_IND_X:
            case IC_IL_SLO_IND_X: 
            case IC_IL_RLA_IND_X: 
            case IC_IL_SRE_IND_X: 
            case IC_IL_RRA_IND_X: 
                /* empty cycle */
                return state;

            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_Y:
                state.rw_mode = CPU_RW_MODE_READ;
                state.address += state.temp * 0x0100;
                return state;

            case IC_IL_SHA_IND_Y:
                _CPU_SHAXY(state, (state.A & state.X), was_halted);
                return state;

            case IC_ROL_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ABS:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ABS: 
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ABS: 
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ABS: 
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ABS: 
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ABS: 
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ABS: 
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ABS: 
                _CPU_RRA(state);
                return state;

            case IC_ROL_ZP_X:
            case IC_ROR_ZP_X:
            case IC_DEC_ZP_X:
            case IC_INC_ZP_X:
            case IC_ASL_ZP_X:
            case IC_LSR_ZP_X:
            case IC_STA_IND_X:
            case IC_IL_SAX_IND_X:
            case IC_IL_DCP_ZP_X:
            case IC_IL_ISB_ZP_X:
            case IC_IL_SLO_ZP_X:
            case IC_IL_RLA_ZP_X:
            case IC_IL_SRE_ZP_X:
            case IC_IL_RRA_ZP_X:
                state.rw_mode = CPU_RW_MODE_NONE;
                // empty cycles
                return state;
            case IC_RTS:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = ((state.data << 8) | state.temp) + 1;
                return state;
            case IC_RTI:
                state.rw_mode = CPU_RW_MODE_NONE;
                state.PC = (state.data << 8) | state.temp;
                return state;

            default: break;
        }
    }
    else if (cycle == 5)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        switch (instruction)
        {
            case IC_BRK:
                state.rw_mode = CPU_RW_MODE_READ;
                state.PC = state.data;
                state.address += 1;
                return state;
            case IC_JSR:
                state.PC = (state.data << 8) | state.temp;
                break;

            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y:
            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y:
            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y:
            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y:
            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y:
            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y:
                state.rw_mode = CPU_RW_MODE_WRITE;
                return state;

            case IC_ROL_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROL(state, state.data);
                return state;

            case IC_ROR_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ROR(state, state.data);
                return state;

            case IC_DEC_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_DEC(state);
                return state;

            case IC_INC_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_INC(state);
                return state;

            case IC_ASL_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_ASL(state, state.data);
                return state;

            case IC_LSR_ABS_X:
                state.rw_mode = CPU_RW_MODE_WRITE;
                _CPU_LSR(state, state.data);
                return state;

            case IC_IL_DCP_ABS_X: case IC_IL_DCP_ABS_Y:
                _CPU_DCP(state);
                return state;

            case IC_IL_ISB_ABS_X: case IC_IL_ISB_ABS_Y:
                _CPU_ISB(state);
                return state;

            case IC_IL_SLO_ABS_X: case IC_IL_SLO_ABS_Y:
                _CPU_SLO(state);
                return state;

            case IC_IL_RLA_ABS_X: case IC_IL_RLA_ABS_Y:
                _CPU_RLA(state);
                return state;

            case IC_IL_SRE_ABS_X: case IC_IL_SRE_ABS_Y:
                _CPU_SRE(state);
                return state;

            case IC_IL_RRA_ABS_X: case IC_IL_RRA_ABS_Y:
                _CPU_RRA(state);
                return state;

            /* Executed if page-cross */
            case IC_LDA_IND_Y: _CPU_SET_REG_A(state, state.data); break;
            case IC_ADC_IND_Y: _CPU_ADC(state); break;
            case IC_SBC_IND_Y: _CPU_SBC(state); break;
            case IC_CMP_IND_Y: _CPU_CMP(state, state.A); break;
            case IC_AND_IND_Y: _CPU_SET_REG_A(state, state.A & state.data); break;
            case IC_ORA_IND_Y: _CPU_SET_REG_A(state, state.A | state.data); break;
            case IC_EOR_IND_Y: _CPU_SET_REG_A(state, state.A ^ state.data); break;
            case IC_IL_LAX_IND_Y: _CPU_LAX(state); break;
        }
    }
    else if (cycle == 6)
    {
        switch(instruction)
        {
            case IC_BRK:
                state.PC = (state.data << 8) | state.PC;
                nmi_phase1 = 0;
                break;
            case IC_IL_DCP_IND_X:
            case IC_IL_DCP_IND_Y: 
                _CPU_DCP(state); 
                return state;

            case IC_IL_ISB_IND_X:
            case IC_IL_ISB_IND_Y: 
                _CPU_ISB(state); 
                return state;

            case IC_IL_SLO_IND_X:
            case IC_IL_SLO_IND_Y: 
                _CPU_SLO(state); 
                return state;

            case IC_IL_RLA_IND_X:
            case IC_IL_RLA_IND_Y: 
                _CPU_RLA(state); 
                return state;

            case IC_IL_SRE_IND_X:
            case IC_IL_SRE_IND_Y: 
                _CPU_SRE(state); 
                return state;

            case IC_IL_RRA_IND_X:
            case IC_IL_RRA_IND_Y: 
                _CPU_RRA(state); 
                return state;
        }
    }

    if (nmi_phase1 || irq_phase1)
    {
        state.rw_mode = CPU_RW_MODE_NONE;
        state.data = 0;
        state.cycle = 0;
        state.temp = 0xFE;
    }
    else
    {
        state.rw_mode = CPU_RW_MODE_READ;
        state.address = state.PC++;
        state.cycle = 0;
        state.temp = 0;
    }

    return state;
}